

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  long lVar4;
  __int_type_conflict _Var5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  bool bVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  ulong uVar55;
  long lVar57;
  byte bVar58;
  uint uVar59;
  ulong uVar60;
  ulong uVar61;
  float fVar62;
  vint4 bi_2;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar68 [16];
  undefined4 uVar63;
  undefined1 auVar69 [16];
  float fVar64;
  undefined1 auVar73 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar96;
  vint4 bi_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar97;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 extraout_var [56];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  vint4 ai_2;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  vint4 ai;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar135;
  float fVar149;
  float fVar150;
  vint4 bi;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar151;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar148 [32];
  float fVar155;
  undefined8 uVar156;
  float fVar175;
  vfloat4 b0;
  float fVar173;
  float fVar177;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar174;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar176;
  float fVar178;
  undefined1 auVar172 [32];
  vfloat4 a0_3;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  float fVar233;
  __m128 a;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar234;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar236;
  float fVar237;
  vfloat4 a0_1;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  float fVar246;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  vfloat4 a0;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar278 [16];
  undefined1 auVar282 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float local_700;
  float fStack_6fc;
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  uint auStack_4b0 [4];
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  uint uStack_340;
  float afStack_33c [7];
  undefined1 local_320 [32];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar56;
  undefined1 auVar95 [64];
  undefined1 auVar118 [32];
  
  PVar2 = prim[1];
  uVar60 = (ulong)(byte)PVar2;
  fVar62 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar126._0_4_ = fVar62 * auVar7._0_4_;
  auVar126._4_4_ = fVar62 * auVar7._4_4_;
  auVar126._8_4_ = fVar62 * auVar7._8_4_;
  auVar126._12_4_ = fVar62 * auVar7._12_4_;
  auVar136._0_4_ = fVar62 * auVar8._0_4_;
  auVar136._4_4_ = fVar62 * auVar8._4_4_;
  auVar136._8_4_ = fVar62 * auVar8._8_4_;
  auVar136._12_4_ = fVar62 * auVar8._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar273 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar273 = vcvtdq2ps_avx(auVar273);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar60 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar55 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + uVar60 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar55 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar269._4_4_ = auVar136._0_4_;
  auVar269._0_4_ = auVar136._0_4_;
  auVar269._8_4_ = auVar136._0_4_;
  auVar269._12_4_ = auVar136._0_4_;
  auVar75 = vshufps_avx(auVar136,auVar136,0x55);
  auVar202 = vshufps_avx(auVar136,auVar136,0xaa);
  fVar62 = auVar202._0_4_;
  auVar238._0_4_ = fVar62 * auVar273._0_4_;
  fVar135 = auVar202._4_4_;
  auVar238._4_4_ = fVar135 * auVar273._4_4_;
  fVar149 = auVar202._8_4_;
  auVar238._8_4_ = fVar149 * auVar273._8_4_;
  fVar150 = auVar202._12_4_;
  auVar238._12_4_ = fVar150 * auVar273._12_4_;
  auVar224._0_4_ = auVar11._0_4_ * fVar62;
  auVar224._4_4_ = auVar11._4_4_ * fVar135;
  auVar224._8_4_ = auVar11._8_4_ * fVar149;
  auVar224._12_4_ = auVar11._12_4_ * fVar150;
  auVar195._0_4_ = auVar98._0_4_ * fVar62;
  auVar195._4_4_ = auVar98._4_4_ * fVar135;
  auVar195._8_4_ = auVar98._8_4_ * fVar149;
  auVar195._12_4_ = auVar98._12_4_ * fVar150;
  auVar202 = vfmadd231ps_fma(auVar238,auVar75,auVar8);
  auVar76 = vfmadd231ps_fma(auVar224,auVar75,auVar10);
  auVar75 = vfmadd231ps_fma(auVar195,auVar65,auVar75);
  auVar109 = vfmadd231ps_fma(auVar202,auVar269,auVar7);
  auVar76 = vfmadd231ps_fma(auVar76,auVar269,auVar9);
  auVar122 = vfmadd231ps_fma(auVar75,auVar66,auVar269);
  auVar270._4_4_ = auVar126._0_4_;
  auVar270._0_4_ = auVar126._0_4_;
  auVar270._8_4_ = auVar126._0_4_;
  auVar270._12_4_ = auVar126._0_4_;
  auVar75 = vshufps_avx(auVar126,auVar126,0x55);
  auVar202 = vshufps_avx(auVar126,auVar126,0xaa);
  fVar62 = auVar202._0_4_;
  auVar137._0_4_ = fVar62 * auVar273._0_4_;
  fVar135 = auVar202._4_4_;
  auVar137._4_4_ = fVar135 * auVar273._4_4_;
  fVar149 = auVar202._8_4_;
  auVar137._8_4_ = fVar149 * auVar273._8_4_;
  fVar150 = auVar202._12_4_;
  auVar137._12_4_ = fVar150 * auVar273._12_4_;
  auVar74._0_4_ = auVar11._0_4_ * fVar62;
  auVar74._4_4_ = auVar11._4_4_ * fVar135;
  auVar74._8_4_ = auVar11._8_4_ * fVar149;
  auVar74._12_4_ = auVar11._12_4_ * fVar150;
  auVar202._0_4_ = auVar98._0_4_ * fVar62;
  auVar202._4_4_ = auVar98._4_4_ * fVar135;
  auVar202._8_4_ = auVar98._8_4_ * fVar149;
  auVar202._12_4_ = auVar98._12_4_ * fVar150;
  auVar8 = vfmadd231ps_fma(auVar137,auVar75,auVar8);
  auVar273 = vfmadd231ps_fma(auVar74,auVar75,auVar10);
  auVar10 = vfmadd231ps_fma(auVar202,auVar75,auVar65);
  auVar11 = vfmadd231ps_fma(auVar8,auVar270,auVar7);
  auVar65 = vfmadd231ps_fma(auVar273,auVar270,auVar9);
  auVar98 = vfmadd231ps_fma(auVar10,auVar270,auVar66);
  auVar278._8_4_ = 0x7fffffff;
  auVar278._0_8_ = 0x7fffffff7fffffff;
  auVar278._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar109,auVar278);
  auVar121._8_4_ = 0x219392ef;
  auVar121._0_8_ = 0x219392ef219392ef;
  auVar121._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar121,1);
  auVar8 = vblendvps_avx(auVar109,auVar121,auVar7);
  auVar7 = vandps_avx(auVar76,auVar278);
  auVar7 = vcmpps_avx(auVar7,auVar121,1);
  auVar273 = vblendvps_avx(auVar76,auVar121,auVar7);
  auVar7 = vandps_avx(auVar122,auVar278);
  auVar7 = vcmpps_avx(auVar7,auVar121,1);
  auVar7 = vblendvps_avx(auVar122,auVar121,auVar7);
  auVar9 = vrcpps_avx(auVar8);
  auVar182._8_4_ = 0x3f800000;
  auVar182._0_8_ = &DAT_3f8000003f800000;
  auVar182._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar182);
  auVar9 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8 = vrcpps_avx(auVar273);
  auVar273 = vfnmadd213ps_fma(auVar273,auVar8,auVar182);
  auVar10 = vfmadd132ps_fma(auVar273,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar8,auVar182);
  auVar66 = vfmadd132ps_fma(auVar7,auVar8,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar11);
  auVar122._0_4_ = auVar9._0_4_ * auVar7._0_4_;
  auVar122._4_4_ = auVar9._4_4_ * auVar7._4_4_;
  auVar122._8_4_ = auVar9._8_4_ * auVar7._8_4_;
  auVar122._12_4_ = auVar9._12_4_ * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar11);
  auVar138._0_4_ = auVar9._0_4_ * auVar7._0_4_;
  auVar138._4_4_ = auVar9._4_4_ * auVar7._4_4_;
  auVar138._8_4_ = auVar9._8_4_ * auVar7._8_4_;
  auVar138._12_4_ = auVar9._12_4_ * auVar7._12_4_;
  auVar76._1_3_ = 0;
  auVar76[0] = PVar2;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar273);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar60 * -2 + 6);
  auVar7 = vpmovsxwd_avx(auVar9);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar65);
  auVar196._0_4_ = auVar7._0_4_ * auVar10._0_4_;
  auVar196._4_4_ = auVar7._4_4_ * auVar10._4_4_;
  auVar196._8_4_ = auVar7._8_4_ * auVar10._8_4_;
  auVar196._12_4_ = auVar7._12_4_ * auVar10._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar8);
  auVar7 = vsubps_avx(auVar7,auVar65);
  auVar75._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar75._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar75._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar75._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar55 + uVar60 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar98);
  auVar109._0_4_ = auVar66._0_4_ * auVar7._0_4_;
  auVar109._4_4_ = auVar66._4_4_ * auVar7._4_4_;
  auVar109._8_4_ = auVar66._8_4_ * auVar7._8_4_;
  auVar109._12_4_ = auVar66._12_4_ * auVar7._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar98);
  auVar65._0_4_ = auVar66._0_4_ * auVar7._0_4_;
  auVar65._4_4_ = auVar66._4_4_ * auVar7._4_4_;
  auVar65._8_4_ = auVar66._8_4_ * auVar7._8_4_;
  auVar65._12_4_ = auVar66._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar122,auVar138);
  auVar8 = vpminsd_avx(auVar196,auVar75);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar109,auVar65);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar213._4_4_ = uVar63;
  auVar213._0_4_ = uVar63;
  auVar213._8_4_ = uVar63;
  auVar213._12_4_ = uVar63;
  auVar8 = vmaxps_avx(auVar8,auVar213);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_450._0_4_ = auVar7._0_4_ * 0.99999964;
  local_450._4_4_ = auVar7._4_4_ * 0.99999964;
  local_450._8_4_ = auVar7._8_4_ * 0.99999964;
  local_450._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar122,auVar138);
  auVar8 = vpmaxsd_avx(auVar196,auVar75);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar109,auVar65);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar98._4_4_ = uVar63;
  auVar98._0_4_ = uVar63;
  auVar98._8_4_ = uVar63;
  auVar98._12_4_ = uVar63;
  auVar8 = vminps_avx(auVar8,auVar98);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar66._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar76[4] = PVar2;
  auVar76._5_3_ = 0;
  auVar76[8] = PVar2;
  auVar76._9_3_ = 0;
  auVar76[0xc] = PVar2;
  auVar76._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar76,_DAT_01ff0cf0);
  auVar7 = vcmpps_avx(local_450,auVar66,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  uVar50 = vmovmskps_avx(auVar7);
  if (uVar50 == 0) {
    return;
  }
  uVar50 = uVar50 & 0xff;
  auVar71._16_16_ = mm_lookupmask_ps._240_16_;
  auVar71._0_16_ = mm_lookupmask_ps._240_16_;
  local_360 = vblendps_avx(auVar71,ZEXT832(0) << 0x20,0x80);
  iVar51 = 1 << ((uint)k & 0x1f);
  auVar72._4_4_ = iVar51;
  auVar72._0_4_ = iVar51;
  auVar72._8_4_ = iVar51;
  auVar72._12_4_ = iVar51;
  auVar72._16_4_ = iVar51;
  auVar72._20_4_ = iVar51;
  auVar72._24_4_ = iVar51;
  auVar72._28_4_ = iVar51;
  auVar13 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar71 = vpand_avx2(auVar72,auVar13);
  local_320 = vpcmpeqd_avx2(auVar71,auVar13);
LAB_016addb2:
  lVar57 = 0;
  for (uVar55 = (ulong)uVar50; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  local_2e0 = *(uint *)(prim + 2);
  uVar55 = (ulong)local_2e0;
  uVar54 = *(uint *)(prim + lVar57 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar55].ptr;
  lVar4 = *(long *)&pGVar3[1].time_range.upper;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)uVar54 *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar7 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar60);
  lVar57 = uVar60 + 1;
  auVar8 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * lVar57);
  _Var5 = pGVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar273 = *(undefined1 (*) [16])(_Var5 + (long)pGVar3[2].userPtr * uVar60);
  auVar9 = *(undefined1 (*) [16])(_Var5 + (long)pGVar3[2].userPtr * lVar57);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar77._8_4_ = 0x3eaaaaab;
  auVar77._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar77._12_4_ = 0x3eaaaaab;
  auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar3[2].intersectionFilterN +
                             (long)pGVar3[2].pointQueryFunc * uVar60),auVar7,auVar77);
  auVar75 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              (long)pGVar3[2].pointQueryFunc * lVar57),auVar8,auVar77);
  auVar66 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar3[3].userPtr +
                             uVar60 * *(long *)&pGVar3[3].fnumTimeSegments),auVar273,auVar77);
  auVar202 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               ((long)pGVar3[3].userPtr +
                               *(long *)&pGVar3[3].fnumTimeSegments * lVar57),auVar9,auVar77);
  auVar67._12_4_ = 0;
  auVar67._0_12_ = ZEXT812(0);
  auVar67 = auVar67 << 0x20;
  auVar78._0_4_ = auVar8._0_4_ * 0.0;
  auVar78._4_4_ = auVar8._4_4_ * 0.0;
  auVar78._8_4_ = auVar8._8_4_ * 0.0;
  auVar78._12_4_ = auVar8._12_4_ * 0.0;
  auVar98 = vfmadd231ps_fma(auVar78,auVar75,auVar67);
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar98);
  local_780._0_4_ = auVar7._0_4_ + auVar65._0_4_;
  local_780._4_4_ = auVar7._4_4_ + auVar65._4_4_;
  fStack_778 = auVar7._8_4_ + auVar65._8_4_;
  fStack_774 = auVar7._12_4_ + auVar65._12_4_;
  auVar271._8_4_ = 0x40400000;
  auVar271._0_8_ = 0x4040000040400000;
  auVar271._12_4_ = 0x40400000;
  auVar65 = vfmadd231ps_fma(auVar98,auVar11,auVar271);
  auVar76 = vfnmadd231ps_fma(auVar65,auVar7,auVar271);
  auVar239._0_4_ = auVar9._0_4_ * 0.0;
  auVar239._4_4_ = auVar9._4_4_ * 0.0;
  auVar239._8_4_ = auVar9._8_4_ * 0.0;
  auVar239._12_4_ = auVar9._12_4_ * 0.0;
  auVar98 = vfmadd231ps_fma(auVar239,auVar202,auVar67);
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar66,auVar98);
  auVar260._0_4_ = auVar273._0_4_ + auVar65._0_4_;
  auVar260._4_4_ = auVar273._4_4_ + auVar65._4_4_;
  auVar260._8_4_ = auVar273._8_4_ + auVar65._8_4_;
  auVar260._12_4_ = auVar273._12_4_ + auVar65._12_4_;
  auVar65 = vfmadd231ps_fma(auVar98,auVar66,auVar271);
  auVar98 = vfnmadd231ps_fma(auVar65,auVar273,auVar271);
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar75,auVar8);
  auVar65 = vfmadd231ps_fma(auVar65,auVar11,auVar67);
  auVar65 = vfmadd231ps_fma(auVar65,auVar7,auVar67);
  auVar123._0_4_ = auVar8._0_4_ * 3.0;
  auVar123._4_4_ = auVar8._4_4_ * 3.0;
  auVar123._8_4_ = auVar8._8_4_ * 3.0;
  auVar123._12_4_ = auVar8._12_4_ * 3.0;
  auVar8 = vfnmadd231ps_fma(auVar123,auVar271,auVar75);
  auVar8 = vfmadd231ps_fma(auVar8,auVar67,auVar11);
  auVar75 = vfnmadd231ps_fma(auVar8,auVar67,auVar7);
  auVar7 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar202,auVar9);
  auVar7 = vfmadd231ps_fma(auVar7,auVar66,auVar67);
  auVar11 = vfmadd231ps_fma(auVar7,auVar273,auVar67);
  auVar183._0_4_ = auVar9._0_4_ * 3.0;
  auVar183._4_4_ = auVar9._4_4_ * 3.0;
  auVar183._8_4_ = auVar9._8_4_ * 3.0;
  auVar183._12_4_ = auVar9._12_4_ * 3.0;
  auVar7 = vfnmadd231ps_fma(auVar183,auVar271,auVar202);
  auVar7 = vfmadd231ps_fma(auVar7,auVar67,auVar66);
  auVar66 = vfnmadd231ps_fma(auVar7,auVar67,auVar273);
  auVar7 = vshufps_avx(auVar76,auVar76,0xc9);
  auVar8 = vshufps_avx(auVar260,auVar260,0xc9);
  fVar62 = auVar76._0_4_;
  auVar197._0_4_ = auVar8._0_4_ * fVar62;
  fVar149 = auVar76._4_4_;
  auVar197._4_4_ = auVar8._4_4_ * fVar149;
  fVar151 = auVar76._8_4_;
  auVar197._8_4_ = auVar8._8_4_ * fVar151;
  fVar97 = auVar76._12_4_;
  auVar197._12_4_ = auVar8._12_4_ * fVar97;
  auVar8 = vfmsub231ps_fma(auVar197,auVar7,auVar260);
  auVar273 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar98,auVar98,0xc9);
  auVar214._0_4_ = auVar8._0_4_ * fVar62;
  auVar214._4_4_ = auVar8._4_4_ * fVar149;
  auVar214._8_4_ = auVar8._8_4_ * fVar151;
  auVar214._12_4_ = auVar8._12_4_ * fVar97;
  auVar7 = vfmsub231ps_fma(auVar214,auVar7,auVar98);
  auVar9 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar8 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar135 = auVar75._0_4_;
  auVar225._0_4_ = auVar8._0_4_ * fVar135;
  fVar150 = auVar75._4_4_;
  auVar225._4_4_ = auVar8._4_4_ * fVar150;
  fVar96 = auVar75._8_4_;
  auVar225._8_4_ = auVar8._8_4_ * fVar96;
  fVar64 = auVar75._12_4_;
  auVar225._12_4_ = auVar8._12_4_ * fVar64;
  auVar8 = vfmsub231ps_fma(auVar225,auVar7,auVar11);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar226._0_4_ = auVar8._0_4_ * fVar135;
  auVar226._4_4_ = auVar8._4_4_ * fVar150;
  auVar226._8_4_ = auVar8._8_4_ * fVar96;
  auVar226._12_4_ = auVar8._12_4_ * fVar64;
  auVar7 = vfmsub231ps_fma(auVar226,auVar7,auVar66);
  auVar66 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vdpps_avx(auVar273,auVar273,0x7f);
  fVar152 = auVar7._0_4_;
  auVar98 = ZEXT416((uint)fVar152);
  auVar8 = vrsqrtss_avx(auVar98,auVar98);
  fVar174 = auVar8._0_4_;
  fVar153 = fVar174 * 1.5 - fVar152 * 0.5 * fVar174 * fVar174 * fVar174;
  auVar8 = vdpps_avx(auVar273,auVar9,0x7f);
  fVar155 = auVar273._0_4_ * fVar153;
  fVar173 = auVar273._4_4_ * fVar153;
  fVar175 = auVar273._8_4_ * fVar153;
  fVar177 = auVar273._12_4_ * fVar153;
  auVar215._0_4_ = fVar152 * auVar9._0_4_;
  auVar215._4_4_ = fVar152 * auVar9._4_4_;
  auVar215._8_4_ = fVar152 * auVar9._8_4_;
  auVar215._12_4_ = fVar152 * auVar9._12_4_;
  fVar174 = auVar8._0_4_;
  auVar198._0_4_ = fVar174 * auVar273._0_4_;
  auVar198._4_4_ = fVar174 * auVar273._4_4_;
  auVar198._8_4_ = fVar174 * auVar273._8_4_;
  auVar198._12_4_ = fVar174 * auVar273._12_4_;
  auVar273 = vsubps_avx(auVar215,auVar198);
  auVar8 = vrcpss_avx(auVar98,auVar98);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar174 = auVar8._0_4_ * auVar7._0_4_;
  auVar7 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar152 = auVar7._0_4_;
  auVar98 = ZEXT416((uint)fVar152);
  auVar8 = vrsqrtss_avx(auVar98,auVar98);
  fVar154 = auVar8._0_4_;
  auVar8 = vdpps_avx(auVar11,auVar66,0x7f);
  fVar154 = fVar154 * 1.5 - fVar152 * 0.5 * fVar154 * fVar154 * fVar154;
  fVar246 = fVar154 * auVar11._0_4_;
  fVar257 = fVar154 * auVar11._4_4_;
  fVar258 = fVar154 * auVar11._8_4_;
  fVar259 = fVar154 * auVar11._12_4_;
  auVar184._0_4_ = fVar152 * auVar66._0_4_;
  auVar184._4_4_ = fVar152 * auVar66._4_4_;
  auVar184._8_4_ = fVar152 * auVar66._8_4_;
  auVar184._12_4_ = fVar152 * auVar66._12_4_;
  fVar152 = auVar8._0_4_;
  auVar139._0_4_ = fVar152 * auVar11._0_4_;
  auVar139._4_4_ = fVar152 * auVar11._4_4_;
  auVar139._8_4_ = fVar152 * auVar11._8_4_;
  auVar139._12_4_ = fVar152 * auVar11._12_4_;
  auVar9 = vsubps_avx(auVar184,auVar139);
  auVar8 = vrcpss_avx(auVar98,auVar98);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,ZEXT416(0x40000000));
  fVar152 = auVar7._0_4_ * auVar8._0_4_;
  auVar7 = vshufps_avx(_local_780,_local_780,0xff);
  auVar216._0_4_ = auVar7._0_4_ * fVar155;
  auVar216._4_4_ = auVar7._4_4_ * fVar173;
  auVar216._8_4_ = auVar7._8_4_ * fVar175;
  auVar216._12_4_ = auVar7._12_4_ * fVar177;
  local_570 = vsubps_avx(_local_780,auVar216);
  auVar8 = vshufps_avx(auVar76,auVar76,0xff);
  auVar157._0_4_ = auVar8._0_4_ * fVar155 + fVar153 * auVar273._0_4_ * fVar174 * auVar7._0_4_;
  auVar157._4_4_ = auVar8._4_4_ * fVar173 + fVar153 * auVar273._4_4_ * fVar174 * auVar7._4_4_;
  auVar157._8_4_ = auVar8._8_4_ * fVar175 + fVar153 * auVar273._8_4_ * fVar174 * auVar7._8_4_;
  auVar157._12_4_ = auVar8._12_4_ * fVar177 + fVar153 * auVar273._12_4_ * fVar174 * auVar7._12_4_;
  auVar273 = vsubps_avx(auVar76,auVar157);
  local_580._0_4_ = auVar216._0_4_ + (float)local_780._0_4_;
  local_580._4_4_ = auVar216._4_4_ + (float)local_780._4_4_;
  fStack_578 = auVar216._8_4_ + fStack_778;
  fStack_574 = auVar216._12_4_ + fStack_774;
  auVar7 = vshufps_avx(auVar65,auVar65,0xff);
  auVar99._0_4_ = fVar246 * auVar7._0_4_;
  auVar99._4_4_ = fVar257 * auVar7._4_4_;
  auVar99._8_4_ = fVar258 * auVar7._8_4_;
  auVar99._12_4_ = fVar259 * auVar7._12_4_;
  local_590 = vsubps_avx(auVar65,auVar99);
  auVar8 = vshufps_avx(auVar75,auVar75,0xff);
  auVar79._0_4_ = fVar246 * auVar8._0_4_ + auVar7._0_4_ * fVar154 * auVar9._0_4_ * fVar152;
  auVar79._4_4_ = fVar257 * auVar8._4_4_ + auVar7._4_4_ * fVar154 * auVar9._4_4_ * fVar152;
  auVar79._8_4_ = fVar258 * auVar8._8_4_ + auVar7._8_4_ * fVar154 * auVar9._8_4_ * fVar152;
  auVar79._12_4_ = fVar259 * auVar8._12_4_ + auVar7._12_4_ * fVar154 * auVar9._12_4_ * fVar152;
  auVar7 = vsubps_avx(auVar75,auVar79);
  fVar155 = auVar65._0_4_ + auVar99._0_4_;
  fVar173 = auVar65._4_4_ + auVar99._4_4_;
  fVar175 = auVar65._8_4_ + auVar99._8_4_;
  fVar177 = auVar65._12_4_ + auVar99._12_4_;
  local_5a0._0_4_ = local_570._0_4_ + auVar273._0_4_ * 0.33333334;
  local_5a0._4_4_ = local_570._4_4_ + auVar273._4_4_ * 0.33333334;
  local_5a0._8_4_ = local_570._8_4_ + auVar273._8_4_ * 0.33333334;
  local_5a0._12_4_ = local_570._12_4_ + auVar273._12_4_ * 0.33333334;
  auVar80._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar80._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar80._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar80._12_4_ = auVar7._12_4_ * 0.33333334;
  local_5b0 = vsubps_avx(local_590,auVar80);
  local_550 = vsubps_avx(local_570,auVar10);
  auVar7 = vshufps_avx(local_550,local_550,0x55);
  auVar8 = vshufps_avx(local_550,local_550,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar174 = pre->ray_space[k].vz.field_0.m128[0];
  fVar152 = pre->ray_space[k].vz.field_0.m128[1];
  fVar153 = pre->ray_space[k].vz.field_0.m128[2];
  fVar154 = pre->ray_space[k].vz.field_0.m128[3];
  auVar81._0_4_ = fVar174 * auVar8._0_4_;
  auVar81._4_4_ = fVar152 * auVar8._4_4_;
  auVar81._8_4_ = fVar153 * auVar8._8_4_;
  auVar81._12_4_ = fVar154 * auVar8._12_4_;
  auVar273 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar1,auVar7);
  local_560 = vsubps_avx(local_5a0,auVar10);
  auVar7 = vshufps_avx(local_560,local_560,0x55);
  auVar8 = vshufps_avx(local_560,local_560,0xaa);
  auVar82._0_4_ = fVar174 * auVar8._0_4_;
  auVar82._4_4_ = fVar152 * auVar8._4_4_;
  auVar82._8_4_ = fVar153 * auVar8._8_4_;
  auVar82._12_4_ = fVar154 * auVar8._12_4_;
  auVar8 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar1,auVar7);
  local_3b0 = vsubps_avx(local_5b0,auVar10);
  auVar7 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar247._0_4_ = fVar174 * auVar7._0_4_;
  auVar247._4_4_ = fVar152 * auVar7._4_4_;
  auVar247._8_4_ = fVar153 * auVar7._8_4_;
  auVar247._12_4_ = fVar154 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_3b0,local_3b0,0x55);
  auVar9 = vfmadd231ps_fma(auVar247,(undefined1  [16])aVar1,auVar7);
  local_3c0 = vsubps_avx(local_590,auVar10);
  auVar7 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar83._0_4_ = fVar174 * auVar7._0_4_;
  auVar83._4_4_ = fVar152 * auVar7._4_4_;
  auVar83._8_4_ = fVar153 * auVar7._8_4_;
  auVar83._12_4_ = fVar154 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_3c0,local_3c0,0x55);
  auVar11 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar1,auVar7);
  local_3d0 = vsubps_avx(_local_580,auVar10);
  auVar7 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar140._0_4_ = fVar174 * auVar7._0_4_;
  auVar140._4_4_ = fVar152 * auVar7._4_4_;
  auVar140._8_4_ = fVar153 * auVar7._8_4_;
  auVar140._12_4_ = fVar154 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_3d0,local_3d0,0x55);
  auVar66 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar1,auVar7);
  local_5c0._0_4_ = (fVar62 + auVar157._0_4_) * 0.33333334 + (float)local_580._0_4_;
  local_5c0._4_4_ = (fVar149 + auVar157._4_4_) * 0.33333334 + (float)local_580._4_4_;
  fStack_5b8 = (fVar151 + auVar157._8_4_) * 0.33333334 + fStack_578;
  fStack_5b4 = (fVar97 + auVar157._12_4_) * 0.33333334 + fStack_574;
  local_3e0 = vsubps_avx(_local_5c0,auVar10);
  auVar7 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar199._0_4_ = auVar7._0_4_ * fVar174;
  auVar199._4_4_ = auVar7._4_4_ * fVar152;
  auVar199._8_4_ = auVar7._8_4_ * fVar153;
  auVar199._12_4_ = auVar7._12_4_ * fVar154;
  auVar7 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar65 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar1,auVar7);
  auVar217._0_4_ = (fVar135 + auVar79._0_4_) * 0.33333334;
  auVar217._4_4_ = (fVar150 + auVar79._4_4_) * 0.33333334;
  auVar217._8_4_ = (fVar96 + auVar79._8_4_) * 0.33333334;
  auVar217._12_4_ = (fVar64 + auVar79._12_4_) * 0.33333334;
  auVar43._4_4_ = fVar173;
  auVar43._0_4_ = fVar155;
  auVar43._8_4_ = fVar175;
  auVar43._12_4_ = fVar177;
  _local_5d0 = vsubps_avx(auVar43,auVar217);
  local_3f0 = vsubps_avx(_local_5d0,auVar10);
  auVar7 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar218._0_4_ = auVar7._0_4_ * fVar174;
  auVar218._4_4_ = auVar7._4_4_ * fVar152;
  auVar218._8_4_ = auVar7._8_4_ * fVar153;
  auVar218._12_4_ = auVar7._12_4_ * fVar154;
  auVar7 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar98 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar1,auVar7);
  local_400 = vsubps_avx(auVar43,auVar10);
  auVar7 = vshufps_avx(local_400,local_400,0xaa);
  auVar84._0_4_ = fVar174 * auVar7._0_4_;
  auVar84._4_4_ = fVar152 * auVar7._4_4_;
  auVar84._8_4_ = fVar153 * auVar7._8_4_;
  auVar84._12_4_ = fVar154 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_400,local_400,0x55);
  auVar7 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar1,auVar7);
  auVar158._4_4_ = local_550._0_4_;
  auVar158._0_4_ = local_550._0_4_;
  auVar158._8_4_ = local_550._0_4_;
  auVar158._12_4_ = local_550._0_4_;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar75 = vfmadd231ps_fma(auVar273,(undefined1  [16])aVar1,auVar158);
  auVar159._4_4_ = local_560._0_4_;
  auVar159._0_4_ = local_560._0_4_;
  auVar159._8_4_ = local_560._0_4_;
  auVar159._12_4_ = local_560._0_4_;
  auVar202 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar159);
  uVar63 = local_3b0._0_4_;
  auVar160._4_4_ = uVar63;
  auVar160._0_4_ = uVar63;
  auVar160._8_4_ = uVar63;
  auVar160._12_4_ = uVar63;
  auVar76 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar160);
  uVar63 = local_3c0._0_4_;
  auVar161._4_4_ = uVar63;
  auVar161._0_4_ = uVar63;
  auVar161._8_4_ = uVar63;
  auVar161._12_4_ = uVar63;
  auVar109 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar161);
  uVar63 = local_3d0._0_4_;
  auVar162._4_4_ = uVar63;
  auVar162._0_4_ = uVar63;
  auVar162._8_4_ = uVar63;
  auVar162._12_4_ = uVar63;
  auVar66 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar1,auVar162);
  uVar63 = local_3e0._0_4_;
  auVar163._4_4_ = uVar63;
  auVar163._0_4_ = uVar63;
  auVar163._8_4_ = uVar63;
  auVar163._12_4_ = uVar63;
  auVar65 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar163);
  uVar63 = local_3f0._0_4_;
  auVar164._4_4_ = uVar63;
  auVar164._0_4_ = uVar63;
  auVar164._8_4_ = uVar63;
  auVar164._12_4_ = uVar63;
  auVar98 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar1,auVar164);
  uVar63 = local_400._0_4_;
  auVar165._4_4_ = uVar63;
  auVar165._0_4_ = uVar63;
  auVar165._8_4_ = uVar63;
  auVar165._12_4_ = uVar63;
  auVar122 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar1,auVar165);
  auVar9 = vmovlhps_avx(auVar75,auVar66);
  auVar10 = vmovlhps_avx(auVar202,auVar65);
  auVar11 = vmovlhps_avx(auVar76,auVar98);
  _local_540 = vmovlhps_avx(auVar109,auVar122);
  auVar7 = vminps_avx(auVar9,auVar10);
  auVar8 = vminps_avx(auVar11,_local_540);
  auVar273 = vminps_avx(auVar7,auVar8);
  auVar7 = vmaxps_avx(auVar9,auVar10);
  auVar8 = vmaxps_avx(auVar11,_local_540);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vshufpd_avx(auVar273,auVar273,3);
  auVar273 = vminps_avx(auVar273,auVar8);
  auVar8 = vshufpd_avx(auVar7,auVar7,3);
  auVar8 = vmaxps_avx(auVar7,auVar8);
  auVar7 = vandps_avx(auVar278,auVar273);
  auVar8 = vandps_avx(auVar278,auVar8);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vmovshdup_avx(auVar7);
  auVar7 = vmaxss_avx(auVar8,auVar7);
  local_2a0 = auVar7._0_4_ * 9.536743e-07;
  local_4c0._8_8_ = auVar75._0_8_;
  local_4c0._0_8_ = auVar75._0_8_;
  local_4d0._8_8_ = auVar202._0_8_;
  local_4d0._0_8_ = auVar202._0_8_;
  local_4e0._0_8_ = auVar76._0_8_;
  local_4e0._8_8_ = local_4e0._0_8_;
  local_780 = auVar109._0_8_;
  local_4f0._8_8_ = local_780;
  local_4f0._0_8_ = local_780;
  local_500 = auVar66._0_8_;
  register0x00001348 = local_500;
  register0x000013c8 = auVar65._0_8_;
  local_510 = auVar65._0_8_;
  register0x00001408 = auVar98._0_8_;
  local_520 = auVar98._0_8_;
  register0x00001448 = auVar122._0_8_;
  local_530 = auVar122._0_8_;
  local_3a0 = ZEXT416((uint)local_2a0);
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  local_2c0 = -local_2a0;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_300 = uVar54;
  uStack_2fc = uVar54;
  uStack_2f8 = uVar54;
  uStack_2f4 = uVar54;
  uStack_2f0 = uVar54;
  uStack_2ec = uVar54;
  uStack_2e8 = uVar54;
  uStack_2e4 = uVar54;
  uVar60 = 0;
  fVar62 = *(float *)(ray + k * 4 + 0x60);
  local_370 = vsubps_avx(auVar10,auVar9);
  local_380 = vsubps_avx(auVar11,auVar10);
  local_390 = vsubps_avx(_local_540,auVar11);
  local_410 = vsubps_avx(_local_580,local_570);
  local_420 = vsubps_avx(_local_5c0,local_5a0);
  local_430 = vsubps_avx(_local_5d0,local_5b0);
  auVar44._4_4_ = fVar173;
  auVar44._0_4_ = fVar155;
  auVar44._8_4_ = fVar175;
  auVar44._12_4_ = fVar177;
  _local_440 = vsubps_avx(auVar44,local_590);
  _local_780 = ZEXT816(0x3f80000000000000);
  auVar7 = _local_780;
  do {
    auVar8 = vshufps_avx(_local_780,_local_780,0x50);
    auVar110._8_4_ = 0x3f800000;
    auVar110._0_8_ = &DAT_3f8000003f800000;
    auVar110._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._0_16_ = auVar110;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar273 = vsubps_avx(auVar110,auVar8);
    fVar135 = auVar8._0_4_;
    auVar68._0_4_ = local_500._0_4_ * fVar135;
    fVar149 = auVar8._4_4_;
    auVar68._4_4_ = local_500._4_4_ * fVar149;
    fVar150 = auVar8._8_4_;
    auVar68._8_4_ = local_500._8_4_ * fVar150;
    fVar151 = auVar8._12_4_;
    auVar68._12_4_ = local_500._12_4_ * fVar151;
    auVar141._0_4_ = local_510._0_4_ * fVar135;
    auVar141._4_4_ = local_510._4_4_ * fVar149;
    auVar141._8_4_ = local_510._8_4_ * fVar150;
    auVar141._12_4_ = local_510._12_4_ * fVar151;
    auVar185._0_4_ = local_520._0_4_ * fVar135;
    auVar185._4_4_ = local_520._4_4_ * fVar149;
    auVar185._8_4_ = local_520._8_4_ * fVar150;
    auVar185._12_4_ = local_520._12_4_ * fVar151;
    auVar272._0_4_ = local_530._0_4_ * fVar135;
    auVar272._4_4_ = local_530._4_4_ * fVar149;
    auVar272._8_4_ = local_530._8_4_ * fVar150;
    auVar272._12_4_ = local_530._12_4_ * fVar151;
    auVar98 = vfmadd231ps_fma(auVar68,auVar273,local_4c0);
    auVar75 = vfmadd231ps_fma(auVar141,auVar273,local_4d0);
    auVar202 = vfmadd231ps_fma(auVar185,auVar273,local_4e0);
    auVar76 = vfmadd231ps_fma(auVar272,local_4f0,auVar273);
    local_700 = auVar76._0_4_;
    auVar8 = vmovshdup_avx(auVar7);
    fVar135 = auVar7._0_4_;
    fVar96 = (auVar8._0_4_ - fVar135) * 0.04761905;
    auVar212._4_4_ = fVar135;
    auVar212._0_4_ = fVar135;
    auVar212._8_4_ = fVar135;
    auVar212._12_4_ = fVar135;
    auVar212._16_4_ = fVar135;
    auVar212._20_4_ = fVar135;
    auVar212._24_4_ = fVar135;
    auVar212._28_4_ = fVar135;
    auVar106._0_8_ = auVar8._0_8_;
    auVar106._8_8_ = auVar106._0_8_;
    auVar106._16_8_ = auVar106._0_8_;
    auVar106._24_8_ = auVar106._0_8_;
    auVar71 = vsubps_avx(auVar106,auVar212);
    uVar63 = auVar98._0_4_;
    auVar282._4_4_ = uVar63;
    auVar282._0_4_ = uVar63;
    auVar282._8_4_ = uVar63;
    auVar282._12_4_ = uVar63;
    auVar282._16_4_ = uVar63;
    auVar282._20_4_ = uVar63;
    auVar282._24_4_ = uVar63;
    auVar282._28_4_ = uVar63;
    auVar8 = vmovshdup_avx(auVar98);
    uVar156 = auVar8._0_8_;
    auVar267._8_8_ = uVar156;
    auVar267._0_8_ = uVar156;
    auVar267._16_8_ = uVar156;
    auVar267._24_8_ = uVar156;
    fVar97 = auVar75._0_4_;
    auVar92._4_4_ = fVar97;
    auVar92._0_4_ = fVar97;
    auVar92._8_4_ = fVar97;
    auVar92._12_4_ = fVar97;
    auVar92._16_4_ = fVar97;
    auVar92._20_4_ = fVar97;
    auVar92._24_4_ = fVar97;
    auVar92._28_4_ = fVar97;
    auVar273 = vmovshdup_avx(auVar75);
    auVar170._0_8_ = auVar273._0_8_;
    auVar170._8_8_ = auVar170._0_8_;
    auVar170._16_8_ = auVar170._0_8_;
    auVar170._24_8_ = auVar170._0_8_;
    fVar152 = auVar202._0_4_;
    auVar245._4_4_ = fVar152;
    auVar245._0_4_ = fVar152;
    auVar245._8_4_ = fVar152;
    auVar245._12_4_ = fVar152;
    auVar245._16_4_ = fVar152;
    auVar245._20_4_ = fVar152;
    auVar245._24_4_ = fVar152;
    auVar245._28_4_ = fVar152;
    auVar66 = vmovshdup_avx(auVar202);
    auVar223._0_8_ = auVar66._0_8_;
    auVar223._8_8_ = auVar223._0_8_;
    auVar223._16_8_ = auVar223._0_8_;
    auVar223._24_8_ = auVar223._0_8_;
    auVar65 = vmovshdup_avx(auVar76);
    auVar109 = vfmadd132ps_fma(auVar71,auVar212,_DAT_02020f20);
    auVar71 = vsubps_avx(auVar118,ZEXT1632(auVar109));
    fVar135 = auVar109._0_4_;
    auVar275._0_4_ = fVar97 * fVar135;
    fVar149 = auVar109._4_4_;
    auVar275._4_4_ = fVar97 * fVar149;
    fVar150 = auVar109._8_4_;
    auVar275._8_4_ = fVar97 * fVar150;
    fVar151 = auVar109._12_4_;
    auVar275._12_4_ = fVar97 * fVar151;
    auVar275._16_4_ = fVar97 * 0.0;
    auVar275._20_4_ = fVar97 * 0.0;
    auVar275._24_4_ = fVar97 * 0.0;
    auVar275._28_4_ = 0;
    auVar109 = vfmadd231ps_fma(auVar275,auVar71,auVar282);
    fVar64 = auVar273._0_4_;
    auVar254._0_4_ = fVar64 * fVar135;
    fVar174 = auVar273._4_4_;
    auVar254._4_4_ = fVar174 * fVar149;
    auVar254._8_4_ = fVar64 * fVar150;
    auVar254._12_4_ = fVar174 * fVar151;
    auVar254._16_4_ = fVar64 * 0.0;
    auVar254._20_4_ = fVar174 * 0.0;
    auVar254._24_4_ = fVar64 * 0.0;
    auVar254._28_4_ = 0;
    auVar122 = vfmadd231ps_fma(auVar254,auVar71,auVar267);
    auVar13._4_4_ = fVar152 * fVar149;
    auVar13._0_4_ = fVar152 * fVar135;
    auVar13._8_4_ = fVar152 * fVar150;
    auVar13._12_4_ = fVar152 * fVar151;
    auVar13._16_4_ = fVar152 * 0.0;
    auVar13._20_4_ = fVar152 * 0.0;
    auVar13._24_4_ = fVar152 * 0.0;
    auVar13._28_4_ = auVar8._4_4_;
    auVar126 = vfmadd231ps_fma(auVar13,auVar71,auVar92);
    fVar64 = auVar66._0_4_;
    fVar174 = auVar66._4_4_;
    auVar73._4_4_ = fVar174 * fVar149;
    auVar73._0_4_ = fVar64 * fVar135;
    auVar73._8_4_ = fVar64 * fVar150;
    auVar73._12_4_ = fVar174 * fVar151;
    auVar73._16_4_ = fVar64 * 0.0;
    auVar73._20_4_ = fVar174 * 0.0;
    auVar73._24_4_ = fVar64 * 0.0;
    auVar73._28_4_ = uVar63;
    auVar74 = vfmadd231ps_fma(auVar73,auVar71,auVar170);
    auVar8 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar171._0_8_ = auVar8._0_8_;
    auVar171._8_8_ = auVar171._0_8_;
    auVar171._16_8_ = auVar171._0_8_;
    auVar171._24_8_ = auVar171._0_8_;
    auVar273 = vshufps_avx(auVar98,auVar98,0xff);
    uStack_718 = auVar273._0_8_;
    local_720 = (undefined1  [8])uStack_718;
    uStack_710 = uStack_718;
    uStack_708 = uStack_718;
    auVar12._4_4_ = fVar149 * local_700;
    auVar12._0_4_ = fVar135 * local_700;
    auVar12._8_4_ = fVar150 * local_700;
    auVar12._12_4_ = fVar151 * local_700;
    auVar12._16_4_ = local_700 * 0.0;
    auVar12._20_4_ = local_700 * 0.0;
    auVar12._24_4_ = local_700 * 0.0;
    auVar12._28_4_ = 0x3f800000;
    auVar121 = vfmadd231ps_fma(auVar12,auVar71,auVar245);
    auVar66 = vshufps_avx(auVar75,auVar75,0xaa);
    auVar133._0_8_ = auVar66._0_8_;
    auVar133._8_8_ = auVar133._0_8_;
    auVar133._16_8_ = auVar133._0_8_;
    auVar133._24_8_ = auVar133._0_8_;
    auVar98 = vshufps_avx(auVar75,auVar75,0xff);
    auVar148._0_8_ = auVar98._0_8_;
    auVar148._8_8_ = auVar148._0_8_;
    auVar148._16_8_ = auVar148._0_8_;
    auVar148._24_8_ = auVar148._0_8_;
    fVar64 = auVar65._0_4_;
    fVar174 = auVar65._4_4_;
    auVar14._4_4_ = fVar174 * fVar149;
    auVar14._0_4_ = fVar64 * fVar135;
    auVar14._8_4_ = fVar64 * fVar150;
    auVar14._12_4_ = fVar174 * fVar151;
    auVar14._16_4_ = fVar64 * 0.0;
    auVar14._20_4_ = fVar174 * 0.0;
    auVar14._24_4_ = fVar64 * 0.0;
    auVar14._28_4_ = fVar152;
    auVar136 = vfmadd231ps_fma(auVar14,auVar71,auVar223);
    auVar15._28_4_ = fVar97;
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(auVar126._12_4_ * fVar151,
                            CONCAT48(auVar126._8_4_ * fVar150,
                                     CONCAT44(auVar126._4_4_ * fVar149,auVar126._0_4_ * fVar135))));
    auVar109 = vfmadd231ps_fma(auVar15,auVar71,ZEXT1632(auVar109));
    auVar16._28_4_ = auVar273._4_4_;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar74._12_4_ * fVar151,
                            CONCAT48(auVar74._8_4_ * fVar150,
                                     CONCAT44(auVar74._4_4_ * fVar149,auVar74._0_4_ * fVar135))));
    auVar122 = vfmadd231ps_fma(auVar16,auVar71,ZEXT1632(auVar122));
    auVar273 = vshufps_avx(auVar202,auVar202,0xaa);
    uVar156 = auVar273._0_8_;
    auVar255._8_8_ = uVar156;
    auVar255._0_8_ = uVar156;
    auVar255._16_8_ = uVar156;
    auVar255._24_8_ = uVar156;
    auVar65 = vshufps_avx(auVar202,auVar202,0xff);
    uVar156 = auVar65._0_8_;
    auVar276._8_8_ = uVar156;
    auVar276._0_8_ = uVar156;
    auVar276._16_8_ = uVar156;
    auVar276._24_8_ = uVar156;
    auVar126 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar121._12_4_,
                                                  CONCAT48(fVar150 * auVar121._8_4_,
                                                           CONCAT44(fVar149 * auVar121._4_4_,
                                                                    fVar135 * auVar121._0_4_)))),
                               auVar71,ZEXT1632(auVar126));
    auVar75 = vshufps_avx(auVar76,auVar76,0xaa);
    auVar202 = vshufps_avx(auVar76,auVar76,0xff);
    local_700 = auVar202._0_4_;
    fStack_6fc = auVar202._4_4_;
    auVar17._28_4_ = fStack_6fc;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar136._12_4_ * fVar151,
                            CONCAT48(auVar136._8_4_ * fVar150,
                                     CONCAT44(auVar136._4_4_ * fVar149,auVar136._0_4_ * fVar135))));
    auVar202 = vfmadd231ps_fma(auVar17,auVar71,ZEXT1632(auVar74));
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar126._12_4_,
                                                 CONCAT48(fVar150 * auVar126._8_4_,
                                                          CONCAT44(fVar149 * auVar126._4_4_,
                                                                   fVar135 * auVar126._0_4_)))),
                              auVar71,ZEXT1632(auVar109));
    auVar13 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar109));
    auVar109 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar202._12_4_,
                                                  CONCAT48(fVar150 * auVar202._8_4_,
                                                           CONCAT44(fVar149 * auVar202._4_4_,
                                                                    fVar135 * auVar202._0_4_)))),
                               auVar71,ZEXT1632(auVar122));
    auVar72 = vsubps_avx(ZEXT1632(auVar202),ZEXT1632(auVar122));
    fVar246 = fVar96 * auVar13._0_4_ * 3.0;
    fVar258 = fVar96 * auVar13._4_4_ * 3.0;
    auVar256._4_4_ = fVar258;
    auVar256._0_4_ = fVar246;
    fVar233 = fVar96 * auVar13._8_4_ * 3.0;
    auVar256._8_4_ = fVar233;
    fVar234 = fVar96 * auVar13._12_4_ * 3.0;
    auVar256._12_4_ = fVar234;
    fVar235 = fVar96 * auVar13._16_4_ * 3.0;
    auVar256._16_4_ = fVar235;
    fVar236 = fVar96 * auVar13._20_4_ * 3.0;
    auVar256._20_4_ = fVar236;
    fVar237 = fVar96 * auVar13._24_4_ * 3.0;
    auVar256._24_4_ = fVar237;
    auVar256._28_4_ = 0x40400000;
    local_740._0_4_ = fVar96 * auVar72._0_4_ * 3.0;
    local_740._4_4_ = fVar96 * auVar72._4_4_ * 3.0;
    fStack_738 = fVar96 * auVar72._8_4_ * 3.0;
    fStack_734 = fVar96 * auVar72._12_4_ * 3.0;
    fStack_730 = fVar96 * auVar72._16_4_ * 3.0;
    fStack_72c = fVar96 * auVar72._20_4_ * 3.0;
    fStack_728 = fVar96 * auVar72._24_4_ * 3.0;
    fStack_724 = auVar72._28_4_;
    fVar97 = auVar66._0_4_;
    fVar64 = auVar66._4_4_;
    auVar18._4_4_ = fVar64 * fVar149;
    auVar18._0_4_ = fVar97 * fVar135;
    auVar18._8_4_ = fVar97 * fVar150;
    auVar18._12_4_ = fVar64 * fVar151;
    auVar18._16_4_ = fVar97 * 0.0;
    auVar18._20_4_ = fVar64 * 0.0;
    auVar18._24_4_ = fVar97 * 0.0;
    auVar18._28_4_ = auVar13._28_4_;
    auVar66 = vfmadd231ps_fma(auVar18,auVar71,auVar171);
    fVar97 = auVar98._0_4_;
    fVar174 = auVar98._4_4_;
    auVar19._4_4_ = fVar174 * fVar149;
    auVar19._0_4_ = fVar97 * fVar135;
    auVar19._8_4_ = fVar97 * fVar150;
    auVar19._12_4_ = fVar174 * fVar151;
    auVar19._16_4_ = fVar97 * 0.0;
    auVar19._20_4_ = fVar174 * 0.0;
    auVar19._24_4_ = fVar97 * 0.0;
    auVar19._28_4_ = auVar8._4_4_;
    auVar8 = vfmadd231ps_fma(auVar19,auVar71,_local_720);
    fVar97 = auVar273._0_4_;
    fVar174 = auVar273._4_4_;
    auVar20._4_4_ = fVar174 * fVar149;
    auVar20._0_4_ = fVar97 * fVar135;
    auVar20._8_4_ = fVar97 * fVar150;
    auVar20._12_4_ = fVar174 * fVar151;
    auVar20._16_4_ = fVar97 * 0.0;
    auVar20._20_4_ = fVar174 * 0.0;
    auVar20._24_4_ = fVar97 * 0.0;
    auVar20._28_4_ = fVar96;
    auVar273 = vfmadd231ps_fma(auVar20,auVar71,auVar133);
    fVar97 = auVar65._0_4_;
    fVar152 = auVar65._4_4_;
    auVar21._4_4_ = fVar152 * fVar149;
    auVar21._0_4_ = fVar97 * fVar135;
    auVar21._8_4_ = fVar97 * fVar150;
    auVar21._12_4_ = fVar152 * fVar151;
    auVar21._16_4_ = fVar97 * 0.0;
    auVar21._20_4_ = fVar152 * 0.0;
    auVar21._24_4_ = fVar97 * 0.0;
    auVar21._28_4_ = fVar64;
    auVar65 = vfmadd231ps_fma(auVar21,auVar71,auVar148);
    auVar14 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar76));
    fVar97 = auVar75._0_4_;
    fVar64 = auVar75._4_4_;
    auVar22._4_4_ = fVar64 * fVar149;
    auVar22._0_4_ = fVar97 * fVar135;
    auVar22._8_4_ = fVar97 * fVar150;
    auVar22._12_4_ = fVar64 * fVar151;
    auVar22._16_4_ = fVar97 * 0.0;
    auVar22._20_4_ = fVar64 * 0.0;
    auVar22._24_4_ = fVar97 * 0.0;
    auVar22._28_4_ = auVar14._28_4_;
    auVar98 = vfmadd231ps_fma(auVar22,auVar71,auVar255);
    auVar15 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar109));
    auVar23._4_4_ = fVar149 * fStack_6fc;
    auVar23._0_4_ = fVar135 * local_700;
    auVar23._8_4_ = fVar150 * local_700;
    auVar23._12_4_ = fVar151 * fStack_6fc;
    auVar23._16_4_ = local_700 * 0.0;
    auVar23._20_4_ = fStack_6fc * 0.0;
    auVar23._24_4_ = local_700 * 0.0;
    auVar23._28_4_ = fVar174;
    auVar75 = vfmadd231ps_fma(auVar23,auVar71,auVar276);
    auVar24._28_4_ = fVar64;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar151 * auVar273._12_4_,
                            CONCAT48(fVar150 * auVar273._8_4_,
                                     CONCAT44(fVar149 * auVar273._4_4_,fVar135 * auVar273._0_4_))));
    auVar66 = vfmadd231ps_fma(auVar24,auVar71,ZEXT1632(auVar66));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar65._12_4_,
                                                CONCAT48(fVar150 * auVar65._8_4_,
                                                         CONCAT44(fVar149 * auVar65._4_4_,
                                                                  fVar135 * auVar65._0_4_)))),
                             auVar71,ZEXT1632(auVar8));
    fVar246 = auVar76._0_4_ + fVar246;
    fVar258 = auVar76._4_4_ + fVar258;
    fVar233 = auVar76._8_4_ + fVar233;
    fVar234 = auVar76._12_4_ + fVar234;
    fVar235 = fVar235 + 0.0;
    fVar236 = fVar236 + 0.0;
    fVar237 = fVar237 + 0.0;
    auVar25._28_4_ = 0x40400000;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(auVar75._12_4_ * fVar151,
                            CONCAT48(auVar75._8_4_ * fVar150,
                                     CONCAT44(auVar75._4_4_ * fVar149,auVar75._0_4_ * fVar135))));
    auVar273 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar98._12_4_,
                                                  CONCAT48(fVar150 * auVar98._8_4_,
                                                           CONCAT44(fVar149 * auVar98._4_4_,
                                                                    fVar135 * auVar98._0_4_)))),
                               auVar71,ZEXT1632(auVar273));
    auVar65 = vfmadd231ps_fma(auVar25,auVar71,ZEXT1632(auVar65));
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar273._12_4_,
                                                 CONCAT48(fVar150 * auVar273._8_4_,
                                                          CONCAT44(fVar149 * auVar273._4_4_,
                                                                   fVar135 * auVar273._0_4_)))),
                              auVar71,ZEXT1632(auVar66));
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar65._12_4_,
                                                 CONCAT48(fVar150 * auVar65._8_4_,
                                                          CONCAT44(fVar149 * auVar65._4_4_,
                                                                   fVar135 * auVar65._0_4_)))),
                              ZEXT1632(auVar8),auVar71);
    auVar71 = vsubps_avx(ZEXT1632(auVar273),ZEXT1632(auVar66));
    auVar13 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar8));
    fVar135 = fVar96 * auVar71._0_4_ * 3.0;
    fVar149 = fVar96 * auVar71._4_4_ * 3.0;
    auVar26._4_4_ = fVar149;
    auVar26._0_4_ = fVar135;
    fVar150 = fVar96 * auVar71._8_4_ * 3.0;
    auVar26._8_4_ = fVar150;
    fVar151 = fVar96 * auVar71._12_4_ * 3.0;
    auVar26._12_4_ = fVar151;
    fVar152 = fVar96 * auVar71._16_4_ * 3.0;
    auVar26._16_4_ = fVar152;
    fVar153 = fVar96 * auVar71._20_4_ * 3.0;
    auVar26._20_4_ = fVar153;
    fVar154 = fVar96 * auVar71._24_4_ * 3.0;
    auVar26._24_4_ = fVar154;
    auVar26._28_4_ = 0x40400000;
    auVar194._0_4_ = fVar96 * auVar13._0_4_ * 3.0;
    auVar194._4_4_ = fVar96 * auVar13._4_4_ * 3.0;
    auVar194._8_4_ = fVar96 * auVar13._8_4_ * 3.0;
    auVar194._12_4_ = fVar96 * auVar13._12_4_ * 3.0;
    auVar194._16_4_ = fVar96 * auVar13._16_4_ * 3.0;
    auVar194._20_4_ = fVar96 * auVar13._20_4_ * 3.0;
    auVar194._24_4_ = fVar96 * auVar13._24_4_ * 3.0;
    auVar194._28_4_ = 0;
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar98));
    local_600 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar75));
    auVar71 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar76));
    auVar13 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar109));
    auVar73 = vsubps_avx(auVar16,auVar14);
    fVar257 = auVar71._0_4_ + auVar73._0_4_;
    fVar259 = auVar71._4_4_ + auVar73._4_4_;
    fVar176 = auVar71._8_4_ + auVar73._8_4_;
    fVar178 = auVar71._12_4_ + auVar73._12_4_;
    fVar179 = auVar71._16_4_ + auVar73._16_4_;
    fVar180 = auVar71._20_4_ + auVar73._20_4_;
    fVar181 = auVar71._24_4_ + auVar73._24_4_;
    auVar12 = vsubps_avx(local_600,auVar15);
    auVar268._0_4_ = auVar13._0_4_ + auVar12._0_4_;
    auVar268._4_4_ = auVar13._4_4_ + auVar12._4_4_;
    auVar268._8_4_ = auVar13._8_4_ + auVar12._8_4_;
    auVar268._12_4_ = auVar13._12_4_ + auVar12._12_4_;
    auVar268._16_4_ = auVar13._16_4_ + auVar12._16_4_;
    auVar268._20_4_ = auVar13._20_4_ + auVar12._20_4_;
    auVar268._24_4_ = auVar13._24_4_ + auVar12._24_4_;
    auVar268._28_4_ = auVar13._28_4_ + auVar12._28_4_;
    fVar96 = auVar109._0_4_;
    local_260 = fVar96 + (float)local_740._0_4_;
    fVar97 = auVar109._4_4_;
    fStack_25c = fVar97 + (float)local_740._4_4_;
    fVar64 = auVar109._8_4_;
    fStack_258 = fVar64 + fStack_738;
    fVar174 = auVar109._12_4_;
    fStack_254 = fVar174 + fStack_734;
    fStack_250 = fStack_730 + 0.0;
    fStack_24c = fStack_72c + 0.0;
    fStack_248 = fStack_728 + 0.0;
    fStack_244 = auVar72._28_4_ + 0.0;
    local_4a0 = ZEXT1632(auVar76);
    auVar13 = vsubps_avx(local_4a0,auVar256);
    local_1e0 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_1c0 = ZEXT1632(auVar109);
    auVar13 = vsubps_avx(local_1c0,_local_740);
    local_280 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_200._0_4_ = auVar98._0_4_ + fVar135;
    local_200._4_4_ = auVar98._4_4_ + fVar149;
    local_200._8_4_ = auVar98._8_4_ + fVar150;
    local_200._12_4_ = auVar98._12_4_ + fVar151;
    local_200._16_4_ = fVar152 + 0.0;
    local_200._20_4_ = fVar153 + 0.0;
    local_200._24_4_ = fVar154 + 0.0;
    local_200._28_4_ = 0x40400000;
    auVar256 = ZEXT1632(auVar98);
    auVar13 = vsubps_avx(auVar256,auVar26);
    auVar17 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    fVar135 = auVar75._0_4_;
    local_240._0_4_ = fVar135 + auVar194._0_4_;
    fVar149 = auVar75._4_4_;
    local_240._4_4_ = fVar149 + auVar194._4_4_;
    fVar150 = auVar75._8_4_;
    local_240._8_4_ = fVar150 + auVar194._8_4_;
    fVar151 = auVar75._12_4_;
    local_240._12_4_ = fVar151 + auVar194._12_4_;
    local_240._16_4_ = auVar194._16_4_ + 0.0;
    local_240._20_4_ = auVar194._20_4_ + 0.0;
    local_240._24_4_ = auVar194._24_4_ + 0.0;
    local_240._28_4_ = 0;
    auVar13 = vsubps_avx(ZEXT1632(auVar75),auVar194);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    auVar27._4_4_ = fVar97 * fVar259;
    auVar27._0_4_ = fVar96 * fVar257;
    auVar27._8_4_ = fVar64 * fVar176;
    auVar27._12_4_ = fVar174 * fVar178;
    auVar27._16_4_ = fVar179 * 0.0;
    auVar27._20_4_ = fVar180 * 0.0;
    auVar27._24_4_ = fVar181 * 0.0;
    auVar27._28_4_ = auVar13._28_4_;
    auVar8 = vfnmadd231ps_fma(auVar27,local_4a0,auVar268);
    auVar28._4_4_ = fStack_25c * fVar259;
    auVar28._0_4_ = local_260 * fVar257;
    auVar28._8_4_ = fStack_258 * fVar176;
    auVar28._12_4_ = fStack_254 * fVar178;
    auVar28._16_4_ = fStack_250 * fVar179;
    auVar28._20_4_ = fStack_24c * fVar180;
    auVar28._24_4_ = fStack_248 * fVar181;
    auVar28._28_4_ = auVar17._28_4_;
    auVar41._4_4_ = fVar258;
    auVar41._0_4_ = fVar246;
    auVar41._8_4_ = fVar233;
    auVar41._12_4_ = fVar234;
    auVar41._16_4_ = fVar235;
    auVar41._20_4_ = fVar236;
    auVar41._24_4_ = fVar237;
    auVar41._28_4_ = 0x40400000;
    auVar273 = vfnmadd231ps_fma(auVar28,auVar268,auVar41);
    auVar29._4_4_ = local_280._4_4_ * fVar259;
    auVar29._0_4_ = local_280._0_4_ * fVar257;
    auVar29._8_4_ = local_280._8_4_ * fVar176;
    auVar29._12_4_ = local_280._12_4_ * fVar178;
    auVar29._16_4_ = local_280._16_4_ * fVar179;
    auVar29._20_4_ = local_280._20_4_ * fVar180;
    auVar29._24_4_ = local_280._24_4_ * fVar181;
    auVar29._28_4_ = fStack_244;
    auVar66 = vfnmadd231ps_fma(auVar29,local_1e0,auVar268);
    local_720._0_4_ = auVar15._0_4_;
    local_720._4_4_ = auVar15._4_4_;
    uStack_718._0_4_ = auVar15._8_4_;
    uStack_718._4_4_ = auVar15._12_4_;
    uStack_710._0_4_ = auVar15._16_4_;
    uStack_710._4_4_ = auVar15._20_4_;
    uStack_708._0_4_ = auVar15._24_4_;
    auVar30._4_4_ = fVar259 * (float)local_720._4_4_;
    auVar30._0_4_ = fVar257 * (float)local_720._0_4_;
    auVar30._8_4_ = fVar176 * (float)uStack_718;
    auVar30._12_4_ = fVar178 * uStack_718._4_4_;
    auVar30._16_4_ = fVar179 * (float)uStack_710;
    auVar30._20_4_ = fVar180 * uStack_710._4_4_;
    auVar30._24_4_ = fVar181 * (float)uStack_708;
    auVar30._28_4_ = local_280._28_4_;
    auVar65 = vfnmadd231ps_fma(auVar30,auVar14,auVar268);
    auVar49._4_4_ = fVar149 * fVar259;
    auVar49._0_4_ = fVar135 * fVar257;
    auVar49._8_4_ = fVar150 * fVar176;
    auVar49._12_4_ = fVar151 * fVar178;
    auVar49._16_4_ = fVar179 * 0.0;
    auVar49._20_4_ = fVar180 * 0.0;
    auVar49._24_4_ = fVar181 * 0.0;
    auVar49._28_4_ = DAT_0205d4a0._28_4_;
    auVar98 = vfnmadd231ps_fma(auVar49,auVar256,auVar268);
    auVar31._4_4_ = local_240._4_4_ * fVar259;
    auVar31._0_4_ = local_240._0_4_ * fVar257;
    auVar31._8_4_ = local_240._8_4_ * fVar176;
    auVar31._12_4_ = local_240._12_4_ * fVar178;
    auVar31._16_4_ = local_240._16_4_ * fVar179;
    auVar31._20_4_ = local_240._20_4_ * fVar180;
    auVar31._24_4_ = local_240._24_4_ * fVar181;
    auVar31._28_4_ = auVar14._28_4_;
    auVar202 = vfnmadd231ps_fma(auVar31,local_200,auVar268);
    auVar32._4_4_ = local_220._4_4_ * fVar259;
    auVar32._0_4_ = local_220._0_4_ * fVar257;
    auVar32._8_4_ = local_220._8_4_ * fVar176;
    auVar32._12_4_ = local_220._12_4_ * fVar178;
    auVar32._16_4_ = local_220._16_4_ * fVar179;
    auVar32._20_4_ = local_220._20_4_ * fVar180;
    auVar32._24_4_ = local_220._24_4_ * fVar181;
    auVar32._28_4_ = local_1e0._28_4_;
    auVar76 = vfnmadd231ps_fma(auVar32,auVar268,auVar17);
    auVar33._4_4_ = local_600._4_4_ * fVar259;
    auVar33._0_4_ = local_600._0_4_ * fVar257;
    auVar33._8_4_ = local_600._8_4_ * fVar176;
    auVar33._12_4_ = local_600._12_4_ * fVar178;
    auVar33._16_4_ = local_600._16_4_ * fVar179;
    auVar33._20_4_ = local_600._20_4_ * fVar180;
    auVar33._24_4_ = local_600._24_4_ * fVar181;
    auVar33._28_4_ = auVar71._28_4_ + auVar73._28_4_;
    auVar109 = vfnmadd231ps_fma(auVar33,auVar268,auVar16);
    auVar13 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar273));
    auVar71 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar273));
    auVar72 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar65));
    auVar72 = vminps_avx(auVar13,auVar72);
    auVar13 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar65));
    auVar71 = vmaxps_avx(auVar71,auVar13);
    auVar73 = vminps_avx(ZEXT1632(auVar98),ZEXT1632(auVar202));
    auVar13 = vmaxps_avx(ZEXT1632(auVar98),ZEXT1632(auVar202));
    auVar12 = vminps_avx(ZEXT1632(auVar76),ZEXT1632(auVar109));
    auVar73 = vminps_avx(auVar73,auVar12);
    auVar73 = vminps_avx(auVar72,auVar73);
    auVar72 = vmaxps_avx(ZEXT1632(auVar76),ZEXT1632(auVar109));
    auVar13 = vmaxps_avx(auVar13,auVar72);
    auVar13 = vmaxps_avx(auVar71,auVar13);
    auVar48._4_4_ = fStack_29c;
    auVar48._0_4_ = local_2a0;
    auVar48._8_4_ = fStack_298;
    auVar48._12_4_ = fStack_294;
    auVar48._16_4_ = fStack_290;
    auVar48._20_4_ = fStack_28c;
    auVar48._24_4_ = fStack_288;
    auVar48._28_4_ = fStack_284;
    auVar71 = vcmpps_avx(auVar73,auVar48,2);
    auVar47._4_4_ = fStack_2bc;
    auVar47._0_4_ = local_2c0;
    auVar47._8_4_ = fStack_2b8;
    auVar47._12_4_ = fStack_2b4;
    auVar47._16_4_ = fStack_2b0;
    auVar47._20_4_ = fStack_2ac;
    auVar47._24_4_ = fStack_2a8;
    auVar47._28_4_ = fStack_2a4;
    auVar13 = vcmpps_avx(auVar13,auVar47,5);
    auVar71 = vandps_avx(auVar13,auVar71);
    auVar13 = local_360 & auVar71;
    uVar52 = 0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(auVar14,local_4a0);
      auVar72 = vsubps_avx(auVar16,auVar256);
      fVar153 = auVar13._0_4_ + auVar72._0_4_;
      fVar154 = auVar13._4_4_ + auVar72._4_4_;
      fVar257 = auVar13._8_4_ + auVar72._8_4_;
      fVar259 = auVar13._12_4_ + auVar72._12_4_;
      fVar176 = auVar13._16_4_ + auVar72._16_4_;
      fVar178 = auVar13._20_4_ + auVar72._20_4_;
      fVar179 = auVar13._24_4_ + auVar72._24_4_;
      auVar73 = vsubps_avx(auVar15,local_1c0);
      auVar12 = vsubps_avx(local_600,ZEXT1632(auVar75));
      auVar93._0_4_ = auVar73._0_4_ + auVar12._0_4_;
      auVar93._4_4_ = auVar73._4_4_ + auVar12._4_4_;
      auVar93._8_4_ = auVar73._8_4_ + auVar12._8_4_;
      auVar93._12_4_ = auVar73._12_4_ + auVar12._12_4_;
      auVar93._16_4_ = auVar73._16_4_ + auVar12._16_4_;
      auVar93._20_4_ = auVar73._20_4_ + auVar12._20_4_;
      auVar93._24_4_ = auVar73._24_4_ + auVar12._24_4_;
      fVar152 = auVar12._28_4_;
      auVar93._28_4_ = auVar73._28_4_ + fVar152;
      auVar277._0_4_ = fVar96 * fVar153;
      auVar277._4_4_ = fVar97 * fVar154;
      auVar277._8_4_ = fVar64 * fVar257;
      auVar277._12_4_ = fVar174 * fVar259;
      auVar277._16_4_ = fVar176 * 0.0;
      auVar277._20_4_ = fVar178 * 0.0;
      auVar277._24_4_ = fVar179 * 0.0;
      auVar277._28_4_ = 0;
      auVar98 = vfnmadd231ps_fma(auVar277,auVar93,local_4a0);
      auVar34._4_4_ = fVar154 * fStack_25c;
      auVar34._0_4_ = fVar153 * local_260;
      auVar34._8_4_ = fVar257 * fStack_258;
      auVar34._12_4_ = fVar259 * fStack_254;
      auVar34._16_4_ = fVar176 * fStack_250;
      auVar34._20_4_ = fVar178 * fStack_24c;
      auVar34._24_4_ = fVar179 * fStack_248;
      auVar34._28_4_ = fVar152;
      auVar42._4_4_ = fVar258;
      auVar42._0_4_ = fVar246;
      auVar42._8_4_ = fVar233;
      auVar42._12_4_ = fVar234;
      auVar42._16_4_ = fVar235;
      auVar42._20_4_ = fVar236;
      auVar42._24_4_ = fVar237;
      auVar42._28_4_ = 0x40400000;
      auVar8 = vfnmadd213ps_fma(auVar42,auVar93,auVar34);
      auVar35._4_4_ = fVar154 * local_280._4_4_;
      auVar35._0_4_ = fVar153 * local_280._0_4_;
      auVar35._8_4_ = fVar257 * local_280._8_4_;
      auVar35._12_4_ = fVar259 * local_280._12_4_;
      auVar35._16_4_ = fVar176 * local_280._16_4_;
      auVar35._20_4_ = fVar178 * local_280._20_4_;
      auVar35._24_4_ = fVar179 * local_280._24_4_;
      auVar35._28_4_ = fVar152;
      auVar273 = vfnmadd213ps_fma(local_1e0,auVar93,auVar35);
      auVar36._4_4_ = (float)local_720._4_4_ * fVar154;
      auVar36._0_4_ = (float)local_720._0_4_ * fVar153;
      auVar36._8_4_ = (float)uStack_718 * fVar257;
      auVar36._12_4_ = uStack_718._4_4_ * fVar259;
      auVar36._16_4_ = (float)uStack_710 * fVar176;
      auVar36._20_4_ = uStack_710._4_4_ * fVar178;
      auVar36._24_4_ = (float)uStack_708 * fVar179;
      auVar36._28_4_ = fVar152;
      auVar75 = vfnmadd231ps_fma(auVar36,auVar93,auVar14);
      auVar107._0_4_ = fVar135 * fVar153;
      auVar107._4_4_ = fVar149 * fVar154;
      auVar107._8_4_ = fVar150 * fVar257;
      auVar107._12_4_ = fVar151 * fVar259;
      auVar107._16_4_ = fVar176 * 0.0;
      auVar107._20_4_ = fVar178 * 0.0;
      auVar107._24_4_ = fVar179 * 0.0;
      auVar107._28_4_ = 0;
      auVar202 = vfnmadd231ps_fma(auVar107,auVar93,auVar256);
      auVar37._4_4_ = fVar154 * local_240._4_4_;
      auVar37._0_4_ = fVar153 * local_240._0_4_;
      auVar37._8_4_ = fVar257 * local_240._8_4_;
      auVar37._12_4_ = fVar259 * local_240._12_4_;
      auVar37._16_4_ = fVar176 * local_240._16_4_;
      auVar37._20_4_ = fVar178 * local_240._20_4_;
      auVar37._24_4_ = fVar179 * local_240._24_4_;
      auVar37._28_4_ = auVar15._28_4_;
      auVar66 = vfnmadd213ps_fma(local_200,auVar93,auVar37);
      auVar38._4_4_ = fVar154 * local_220._4_4_;
      auVar38._0_4_ = fVar153 * local_220._0_4_;
      auVar38._8_4_ = fVar257 * local_220._8_4_;
      auVar38._12_4_ = fVar259 * local_220._12_4_;
      auVar38._16_4_ = fVar176 * local_220._16_4_;
      auVar38._20_4_ = fVar178 * local_220._20_4_;
      auVar38._24_4_ = fVar179 * local_220._24_4_;
      auVar38._28_4_ = auVar15._28_4_;
      auVar65 = vfnmadd213ps_fma(auVar17,auVar93,auVar38);
      auVar39._4_4_ = local_600._4_4_ * fVar154;
      auVar39._0_4_ = local_600._0_4_ * fVar153;
      auVar39._8_4_ = local_600._8_4_ * fVar257;
      auVar39._12_4_ = local_600._12_4_ * fVar259;
      auVar39._16_4_ = local_600._16_4_ * fVar176;
      auVar39._20_4_ = local_600._20_4_ * fVar178;
      auVar39._24_4_ = local_600._24_4_ * fVar179;
      auVar39._28_4_ = auVar13._28_4_ + auVar72._28_4_;
      auVar76 = vfnmadd231ps_fma(auVar39,auVar93,auVar16);
      auVar72 = vminps_avx(ZEXT1632(auVar98),ZEXT1632(auVar8));
      auVar13 = vmaxps_avx(ZEXT1632(auVar98),ZEXT1632(auVar8));
      auVar73 = vminps_avx(ZEXT1632(auVar273),ZEXT1632(auVar75));
      auVar73 = vminps_avx(auVar72,auVar73);
      auVar72 = vmaxps_avx(ZEXT1632(auVar273),ZEXT1632(auVar75));
      auVar13 = vmaxps_avx(auVar13,auVar72);
      auVar12 = vminps_avx(ZEXT1632(auVar202),ZEXT1632(auVar66));
      auVar72 = vmaxps_avx(ZEXT1632(auVar202),ZEXT1632(auVar66));
      auVar14 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar76));
      auVar12 = vminps_avx(auVar12,auVar14);
      auVar12 = vminps_avx(auVar73,auVar12);
      auVar73 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar76));
      auVar72 = vmaxps_avx(auVar72,auVar73);
      auVar72 = vmaxps_avx(auVar13,auVar72);
      auVar13 = vcmpps_avx(auVar12,auVar48,2);
      auVar72 = vcmpps_avx(auVar72,auVar47,5);
      auVar13 = vandps_avx(auVar72,auVar13);
      auVar71 = vandps_avx(auVar71,local_360);
      auVar72 = auVar71 & auVar13;
      if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0x7f,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar72 >> 0xbf,0) != '\0') ||
          (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar72[0x1f] < '\0') {
        auVar71 = vandps_avx(auVar13,auVar71);
        uVar52 = vmovmskps_avx(auVar71);
      }
    }
    if (uVar52 != 0) {
      auStack_4b0[uVar60] = uVar52;
      uVar156 = vmovlps_avx(auVar7);
      *(undefined8 *)(&uStack_340 + uVar60 * 2) = uVar156;
      uVar61 = vmovlps_avx(_local_780);
      auStack_1a0[uVar60] = uVar61;
      uVar60 = (ulong)((int)uVar60 + 1);
    }
    do {
      if ((int)uVar60 == 0) {
        uVar63 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar70._4_4_ = uVar63;
        auVar70._0_4_ = uVar63;
        auVar70._8_4_ = uVar63;
        auVar70._12_4_ = uVar63;
        auVar7 = vcmpps_avx(local_450,auVar70,2);
        uVar54 = vmovmskps_avx(auVar7);
        uVar50 = uVar50 & uVar50 + 0xf & uVar54;
        if (uVar50 == 0) {
          return;
        }
        goto LAB_016addb2;
      }
      uVar53 = (int)uVar60 - 1;
      uVar56 = (ulong)uVar53;
      uVar59 = auStack_4b0[uVar56];
      uVar52 = (&uStack_340)[uVar56 * 2];
      fVar135 = afStack_33c[uVar56 * 2];
      iVar51 = 0;
      for (uVar61 = (ulong)uVar59; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        iVar51 = iVar51 + 1;
      }
      uVar59 = uVar59 - 1 & uVar59;
      if (uVar59 == 0) {
        uVar60 = (ulong)uVar53;
      }
      register0x00001348 = 0;
      local_780 = (undefined1  [8])auStack_1a0[uVar56];
      auStack_4b0[uVar56] = uVar59;
      fVar149 = (float)(iVar51 + 1) * 0.14285715;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * (float)iVar51 * 0.14285715)),ZEXT416(uVar52)
                               ,ZEXT416((uint)(1.0 - (float)iVar51 * 0.14285715)));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar149)),ZEXT416(uVar52),
                               ZEXT416((uint)(1.0 - fVar149)));
      auVar172._0_4_ = auVar7._0_4_;
      fVar149 = auVar8._0_4_;
      fVar135 = fVar149 - auVar172._0_4_;
      if (0.16666667 <= fVar135) break;
      auVar273 = vshufps_avx(_local_780,_local_780,0x50);
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = &DAT_3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar66 = vsubps_avx(auVar100,auVar273);
      fVar150 = auVar273._0_4_;
      auVar111._0_4_ = fVar150 * (float)local_500._0_4_;
      fVar151 = auVar273._4_4_;
      auVar111._4_4_ = fVar151 * (float)local_500._4_4_;
      fVar96 = auVar273._8_4_;
      auVar111._8_4_ = fVar96 * fStack_4f8;
      fVar97 = auVar273._12_4_;
      auVar111._12_4_ = fVar97 * fStack_4f4;
      auVar124._0_4_ = fVar150 * (float)local_510._0_4_;
      auVar124._4_4_ = fVar151 * (float)local_510._4_4_;
      auVar124._8_4_ = fVar96 * fStack_508;
      auVar124._12_4_ = fVar97 * fStack_504;
      auVar142._0_4_ = fVar150 * (float)local_520._0_4_;
      auVar142._4_4_ = fVar151 * (float)local_520._4_4_;
      auVar142._8_4_ = fVar96 * fStack_518;
      auVar142._12_4_ = fVar97 * fStack_514;
      auVar85._0_4_ = fVar150 * (float)local_530._0_4_;
      auVar85._4_4_ = fVar151 * (float)local_530._4_4_;
      auVar85._8_4_ = fVar96 * fStack_528;
      auVar85._12_4_ = fVar97 * fStack_524;
      auVar273 = vfmadd231ps_fma(auVar111,auVar66,local_4c0);
      auVar65 = vfmadd231ps_fma(auVar124,auVar66,local_4d0);
      auVar98 = vfmadd231ps_fma(auVar142,auVar66,local_4e0);
      auVar66 = vfmadd231ps_fma(auVar85,auVar66,local_4f0);
      auVar108._16_16_ = auVar273;
      auVar108._0_16_ = auVar273;
      auVar119._16_16_ = auVar65;
      auVar119._0_16_ = auVar65;
      auVar134._16_16_ = auVar98;
      auVar134._0_16_ = auVar98;
      auVar172._4_4_ = auVar172._0_4_;
      auVar172._8_4_ = auVar172._0_4_;
      auVar172._12_4_ = auVar172._0_4_;
      auVar172._20_4_ = fVar149;
      auVar172._16_4_ = fVar149;
      auVar172._24_4_ = fVar149;
      auVar172._28_4_ = fVar149;
      auVar71 = vsubps_avx(auVar119,auVar108);
      auVar65 = vfmadd213ps_fma(auVar71,auVar172,auVar108);
      auVar71 = vsubps_avx(auVar134,auVar119);
      auVar75 = vfmadd213ps_fma(auVar71,auVar172,auVar119);
      auVar273 = vsubps_avx(auVar66,auVar98);
      auVar120._16_16_ = auVar273;
      auVar120._0_16_ = auVar273;
      auVar273 = vfmadd213ps_fma(auVar120,auVar172,auVar134);
      auVar71 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar65));
      auVar66 = vfmadd213ps_fma(auVar71,auVar172,ZEXT1632(auVar65));
      auVar71 = vsubps_avx(ZEXT1632(auVar273),ZEXT1632(auVar75));
      auVar273 = vfmadd213ps_fma(auVar71,auVar172,ZEXT1632(auVar75));
      auVar71 = vsubps_avx(ZEXT1632(auVar273),ZEXT1632(auVar66));
      auVar109 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar71,auVar172);
      fVar174 = auVar71._4_4_ * 3.0;
      fVar64 = fVar135 * 0.33333334;
      auVar227._0_8_ =
           CONCAT44(auVar109._4_4_ + fVar64 * fVar174,auVar109._0_4_ + fVar64 * auVar71._0_4_ * 3.0)
      ;
      auVar227._8_4_ = auVar109._8_4_ + fVar64 * auVar71._8_4_ * 3.0;
      auVar227._12_4_ = auVar109._12_4_ + fVar64 * auVar71._12_4_ * 3.0;
      auVar66 = vshufpd_avx(auVar109,auVar109,3);
      auVar65 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar273 = vsubps_avx(auVar66,auVar109);
      auVar98 = vsubps_avx(auVar65,(undefined1  [16])0x0);
      auVar101._0_4_ = auVar273._0_4_ + auVar98._0_4_;
      auVar101._4_4_ = auVar273._4_4_ + auVar98._4_4_;
      auVar101._8_4_ = auVar273._8_4_ + auVar98._8_4_;
      auVar101._12_4_ = auVar273._12_4_ + auVar98._12_4_;
      auVar273 = vshufps_avx(auVar109,auVar109,0xb1);
      auVar98 = vshufps_avx(auVar227,auVar227,0xb1);
      auVar261._4_4_ = auVar101._0_4_;
      auVar261._0_4_ = auVar101._0_4_;
      auVar261._8_4_ = auVar101._0_4_;
      auVar261._12_4_ = auVar101._0_4_;
      auVar75 = vshufps_avx(auVar101,auVar101,0x55);
      fVar150 = auVar75._0_4_;
      auVar186._0_4_ = auVar273._0_4_ * fVar150;
      fVar151 = auVar75._4_4_;
      auVar186._4_4_ = auVar273._4_4_ * fVar151;
      fVar96 = auVar75._8_4_;
      auVar186._8_4_ = auVar273._8_4_ * fVar96;
      fVar97 = auVar75._12_4_;
      auVar186._12_4_ = auVar273._12_4_ * fVar97;
      auVar200._0_4_ = auVar98._0_4_ * fVar150;
      auVar200._4_4_ = auVar98._4_4_ * fVar151;
      auVar200._8_4_ = auVar98._8_4_ * fVar96;
      auVar200._12_4_ = auVar98._12_4_ * fVar97;
      auVar202 = vfmadd231ps_fma(auVar186,auVar261,auVar109);
      auVar76 = vfmadd231ps_fma(auVar200,auVar261,auVar227);
      auVar98 = vshufps_avx(auVar202,auVar202,0xe8);
      auVar75 = vshufps_avx(auVar76,auVar76,0xe8);
      auVar273 = vcmpps_avx(auVar98,auVar75,1);
      uVar52 = vextractps_avx(auVar273,0);
      auVar122 = auVar76;
      if ((uVar52 & 1) == 0) {
        auVar122 = auVar202;
      }
      auVar125._0_4_ = fVar64 * auVar71._16_4_ * 3.0;
      auVar125._4_4_ = fVar64 * fVar174;
      auVar125._8_4_ = fVar64 * auVar71._24_4_ * 3.0;
      auVar125._12_4_ = fVar64 * fVar149;
      auVar136 = vsubps_avx((undefined1  [16])0x0,auVar125);
      auVar126 = vshufps_avx(auVar136,auVar136,0xb1);
      auVar74 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar279._0_4_ = auVar126._0_4_ * fVar150;
      auVar279._4_4_ = auVar126._4_4_ * fVar151;
      auVar279._8_4_ = auVar126._8_4_ * fVar96;
      auVar279._12_4_ = auVar126._12_4_ * fVar97;
      auVar102._0_4_ = auVar74._0_4_ * fVar150;
      auVar102._4_4_ = auVar74._4_4_ * fVar151;
      auVar102._8_4_ = auVar74._8_4_ * fVar96;
      auVar102._12_4_ = auVar74._12_4_ * fVar97;
      auVar137 = vfmadd231ps_fma(auVar279,auVar261,auVar136);
      auVar138 = vfmadd231ps_fma(auVar102,(undefined1  [16])0x0,auVar261);
      auVar74 = vshufps_avx(auVar137,auVar137,0xe8);
      auVar121 = vshufps_avx(auVar138,auVar138,0xe8);
      auVar126 = vcmpps_avx(auVar74,auVar121,1);
      uVar52 = vextractps_avx(auVar126,0);
      auVar182 = auVar138;
      if ((uVar52 & 1) == 0) {
        auVar182 = auVar137;
      }
      auVar122 = vmaxss_avx(auVar182,auVar122);
      auVar98 = vminps_avx(auVar98,auVar75);
      auVar75 = vminps_avx(auVar74,auVar121);
      auVar75 = vminps_avx(auVar98,auVar75);
      auVar273 = vshufps_avx(auVar273,auVar273,0x55);
      auVar273 = vblendps_avx(auVar273,auVar126,2);
      auVar126 = vpslld_avx(auVar273,0x1f);
      auVar273 = vshufpd_avx(auVar76,auVar76,1);
      auVar273 = vinsertps_avx(auVar273,auVar138,0x9c);
      auVar98 = vshufpd_avx(auVar202,auVar202,1);
      auVar98 = vinsertps_avx(auVar98,auVar137,0x9c);
      auVar273 = vblendvps_avx(auVar98,auVar273,auVar126);
      auVar98 = vmovshdup_avx(auVar273);
      auVar273 = vmaxss_avx(auVar98,auVar273);
      fVar96 = auVar75._0_4_;
      auVar98 = vmovshdup_avx(auVar75);
      fVar151 = auVar273._0_4_;
      fVar150 = auVar122._0_4_;
      if ((0.0001 <= fVar96) || (fVar151 <= -0.0001)) {
        auVar202 = vcmpps_avx(auVar98,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar76 = vcmpps_avx(auVar75,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar202 = vorps_avx(auVar76,auVar202);
        if ((-0.0001 < fVar150 & auVar202[0]) != 0) goto LAB_016aee02;
        auVar202 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar273,5);
        auVar76 = vcmpps_avx(auVar98,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar202 = vorps_avx(auVar76,auVar202);
        if ((auVar202 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016aee02;
LAB_016af7c1:
        bVar40 = true;
      }
      else {
LAB_016aee02:
        auVar76 = vcmpps_avx(auVar75,_DAT_01feba10,1);
        auVar126 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar202 = vcmpss_avx(auVar122,ZEXT816(0) << 0x20,1);
        auVar143._8_4_ = 0x3f800000;
        auVar143._0_8_ = &DAT_3f8000003f800000;
        auVar143._12_4_ = 0x3f800000;
        auVar201._8_4_ = 0xbf800000;
        auVar201._0_8_ = 0xbf800000bf800000;
        auVar201._12_4_ = 0xbf800000;
        auVar202 = vblendvps_avx(auVar143,auVar201,auVar202);
        auVar76 = vblendvps_avx(auVar143,auVar201,auVar76);
        fVar97 = auVar76._0_4_;
        fVar64 = auVar202._0_4_;
        auVar202 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar97 == fVar64) && (!NAN(fVar97) && !NAN(fVar64))) {
          auVar202 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar74 = ZEXT816(0) << 0x20;
        if ((fVar97 == fVar64) && (!NAN(fVar97) && !NAN(fVar64))) {
          auVar126 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar76 = vmovshdup_avx(auVar76);
        fVar174 = auVar76._0_4_;
        if ((fVar97 != fVar174) || (NAN(fVar97) || NAN(fVar174))) {
          fVar97 = auVar98._0_4_;
          if ((fVar97 != fVar96) || (NAN(fVar97) || NAN(fVar96))) {
            auVar103._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
            auVar103._8_4_ = auVar75._8_4_ ^ 0x80000000;
            auVar103._12_4_ = auVar75._12_4_ ^ 0x80000000;
            auVar127._0_4_ = -fVar96 / (fVar97 - fVar96);
            auVar127._4_12_ = auVar103._4_12_;
            auVar98 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar74,auVar127);
            auVar75 = auVar98;
          }
          else {
            auVar98 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar96 == 0.0) && (auVar98 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar96))) {
              auVar98 = ZEXT816(0);
            }
            auVar75 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar96 == 0.0) && (auVar75 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar96))) {
              auVar75 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar202 = vminss_avx(auVar202,auVar98);
          auVar126 = vmaxss_avx(auVar75,auVar126);
        }
        auVar273 = vcmpss_avx(auVar273,auVar74,1);
        auVar128._8_4_ = 0x3f800000;
        auVar128._0_8_ = &DAT_3f8000003f800000;
        auVar128._12_4_ = 0x3f800000;
        auVar144._8_4_ = 0xbf800000;
        auVar144._0_8_ = 0xbf800000bf800000;
        auVar144._12_4_ = 0xbf800000;
        auVar273 = vblendvps_avx(auVar128,auVar144,auVar273);
        fVar96 = auVar273._0_4_;
        auVar273 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar64 != fVar96) || (NAN(fVar64) || NAN(fVar96))) {
          if ((fVar151 != fVar150) || (NAN(fVar151) || NAN(fVar150))) {
            auVar104._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
            auVar104._8_4_ = auVar122._8_4_ ^ 0x80000000;
            auVar104._12_4_ = auVar122._12_4_ ^ 0x80000000;
            auVar129._0_4_ = -fVar150 / (fVar151 - fVar150);
            auVar129._4_12_ = auVar104._4_12_;
            auVar98 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar129._0_4_)),auVar74,auVar129);
            auVar75 = auVar98;
          }
          else {
            auVar98 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar150 == 0.0) && (auVar98 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar150))) {
              auVar98 = ZEXT816(0);
            }
            auVar75 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar150 == 0.0) && (auVar75 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar150))) {
              auVar75 = auVar273;
            }
          }
          auVar202 = vminss_avx(auVar202,auVar98);
          auVar126 = vmaxss_avx(auVar75,auVar126);
        }
        if ((fVar174 != fVar96) || (NAN(fVar174) || NAN(fVar96))) {
          auVar202 = vminss_avx(auVar202,auVar273);
          auVar126 = vmaxss_avx(auVar273,auVar126);
        }
        auVar98 = vmaxss_avx(auVar74,auVar202);
        auVar75 = vminss_avx(auVar126,auVar273);
        bVar40 = true;
        if (auVar98._0_4_ <= auVar75._0_4_) {
          auVar98 = vmaxss_avx(auVar74,ZEXT416((uint)(auVar98._0_4_ + -0.1)));
          auVar273 = vminss_avx(ZEXT416((uint)(auVar75._0_4_ + 0.1)),auVar273);
          auVar86._0_8_ = auVar109._0_8_;
          auVar86._8_8_ = auVar86._0_8_;
          auVar203._8_8_ = auVar227._0_8_;
          auVar203._0_8_ = auVar227._0_8_;
          auVar219._8_8_ = auVar136._0_8_;
          auVar219._0_8_ = auVar136._0_8_;
          auVar75 = vshufpd_avx(auVar227,auVar227,3);
          auVar202 = vshufpd_avx(auVar136,auVar136,3);
          auVar76 = vshufps_avx(auVar98,auVar273,0);
          auVar112._8_4_ = 0x3f800000;
          auVar112._0_8_ = &DAT_3f8000003f800000;
          auVar112._12_4_ = 0x3f800000;
          auVar109 = vsubps_avx(auVar112,auVar76);
          local_740._0_4_ = auVar66._0_4_;
          local_740._4_4_ = auVar66._4_4_;
          fStack_738 = auVar66._8_4_;
          fStack_734 = auVar66._12_4_;
          fVar150 = auVar76._0_4_;
          auVar113._0_4_ = fVar150 * (float)local_740._0_4_;
          fVar151 = auVar76._4_4_;
          auVar113._4_4_ = fVar151 * (float)local_740._4_4_;
          fVar96 = auVar76._8_4_;
          auVar113._8_4_ = fVar96 * fStack_738;
          fVar97 = auVar76._12_4_;
          auVar113._12_4_ = fVar97 * fStack_734;
          auVar130._0_4_ = auVar75._0_4_ * fVar150;
          auVar130._4_4_ = auVar75._4_4_ * fVar151;
          auVar130._8_4_ = auVar75._8_4_ * fVar96;
          auVar130._12_4_ = auVar75._12_4_ * fVar97;
          auVar145._0_4_ = auVar202._0_4_ * fVar150;
          auVar145._4_4_ = auVar202._4_4_ * fVar151;
          auVar145._8_4_ = auVar202._8_4_ * fVar96;
          auVar145._12_4_ = auVar202._12_4_ * fVar97;
          local_720._0_4_ = auVar65._0_4_;
          local_720._4_4_ = auVar65._4_4_;
          uStack_718._0_4_ = auVar65._8_4_;
          uStack_718._4_4_ = auVar65._12_4_;
          auVar166._0_4_ = fVar150 * (float)local_720._0_4_;
          auVar166._4_4_ = fVar151 * (float)local_720._4_4_;
          auVar166._8_4_ = fVar96 * (float)uStack_718;
          auVar166._12_4_ = fVar97 * uStack_718._4_4_;
          auVar75 = vfmadd231ps_fma(auVar113,auVar109,auVar86);
          auVar202 = vfmadd231ps_fma(auVar130,auVar109,auVar203);
          auVar76 = vfmadd231ps_fma(auVar145,auVar109,auVar219);
          auVar109 = vfmadd231ps_fma(auVar166,auVar109,ZEXT816(0));
          auVar66 = vmovshdup_avx(_local_780);
          auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar98._0_4_)),_local_780,
                                    ZEXT416((uint)(1.0 - auVar98._0_4_)));
          auVar121 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar273._0_4_)),_local_780,
                                     ZEXT416((uint)(1.0 - auVar273._0_4_)));
          fVar150 = 1.0 / fVar135;
          auVar273 = vsubps_avx(auVar202,auVar75);
          auVar187._0_4_ = auVar273._0_4_ * 3.0;
          auVar187._4_4_ = auVar273._4_4_ * 3.0;
          auVar187._8_4_ = auVar273._8_4_ * 3.0;
          auVar187._12_4_ = auVar273._12_4_ * 3.0;
          auVar273 = vsubps_avx(auVar76,auVar202);
          auVar204._0_4_ = auVar273._0_4_ * 3.0;
          auVar204._4_4_ = auVar273._4_4_ * 3.0;
          auVar204._8_4_ = auVar273._8_4_ * 3.0;
          auVar204._12_4_ = auVar273._12_4_ * 3.0;
          auVar273 = vsubps_avx(auVar109,auVar76);
          auVar220._0_4_ = auVar273._0_4_ * 3.0;
          auVar220._4_4_ = auVar273._4_4_ * 3.0;
          auVar220._8_4_ = auVar273._8_4_ * 3.0;
          auVar220._12_4_ = auVar273._12_4_ * 3.0;
          auVar66 = vminps_avx(auVar204,auVar220);
          auVar273 = vmaxps_avx(auVar204,auVar220);
          auVar66 = vminps_avx(auVar187,auVar66);
          auVar273 = vmaxps_avx(auVar187,auVar273);
          auVar65 = vshufpd_avx(auVar66,auVar66,3);
          auVar98 = vshufpd_avx(auVar273,auVar273,3);
          auVar66 = vminps_avx(auVar66,auVar65);
          auVar273 = vmaxps_avx(auVar273,auVar98);
          auVar205._0_4_ = auVar66._0_4_ * fVar150;
          auVar205._4_4_ = auVar66._4_4_ * fVar150;
          auVar205._8_4_ = auVar66._8_4_ * fVar150;
          auVar205._12_4_ = auVar66._12_4_ * fVar150;
          auVar188._0_4_ = fVar150 * auVar273._0_4_;
          auVar188._4_4_ = fVar150 * auVar273._4_4_;
          auVar188._8_4_ = fVar150 * auVar273._8_4_;
          auVar188._12_4_ = fVar150 * auVar273._12_4_;
          fVar150 = 1.0 / (auVar121._0_4_ - auVar74._0_4_);
          auVar273 = vshufpd_avx(auVar75,auVar75,3);
          auVar66 = vshufpd_avx(auVar202,auVar202,3);
          auVar65 = vshufpd_avx(auVar76,auVar76,3);
          auVar98 = vshufpd_avx(auVar109,auVar109,3);
          auVar273 = vsubps_avx(auVar273,auVar75);
          auVar75 = vsubps_avx(auVar66,auVar202);
          auVar202 = vsubps_avx(auVar65,auVar76);
          auVar98 = vsubps_avx(auVar98,auVar109);
          auVar66 = vminps_avx(auVar273,auVar75);
          auVar273 = vmaxps_avx(auVar273,auVar75);
          auVar65 = vminps_avx(auVar202,auVar98);
          auVar65 = vminps_avx(auVar66,auVar65);
          auVar66 = vmaxps_avx(auVar202,auVar98);
          auVar273 = vmaxps_avx(auVar273,auVar66);
          auVar240._0_4_ = fVar150 * auVar65._0_4_;
          auVar240._4_4_ = fVar150 * auVar65._4_4_;
          auVar240._8_4_ = fVar150 * auVar65._8_4_;
          auVar240._12_4_ = fVar150 * auVar65._12_4_;
          auVar228._0_4_ = fVar150 * auVar273._0_4_;
          auVar228._4_4_ = fVar150 * auVar273._4_4_;
          auVar228._8_4_ = fVar150 * auVar273._8_4_;
          auVar228._12_4_ = fVar150 * auVar273._12_4_;
          auVar98 = vinsertps_avx(auVar7,auVar74,0x10);
          auVar75 = vinsertps_avx(auVar8,auVar121,0x10);
          auVar69._0_4_ = (auVar98._0_4_ + auVar75._0_4_) * 0.5;
          auVar69._4_4_ = (auVar98._4_4_ + auVar75._4_4_) * 0.5;
          auVar69._8_4_ = (auVar98._8_4_ + auVar75._8_4_) * 0.5;
          auVar69._12_4_ = (auVar98._12_4_ + auVar75._12_4_) * 0.5;
          auVar114._4_4_ = auVar69._0_4_;
          auVar114._0_4_ = auVar69._0_4_;
          auVar114._8_4_ = auVar69._0_4_;
          auVar114._12_4_ = auVar69._0_4_;
          auVar273 = vfmadd213ps_fma(local_370,auVar114,auVar9);
          auVar66 = vfmadd213ps_fma(local_380,auVar114,auVar10);
          auVar65 = vfmadd213ps_fma(local_390,auVar114,auVar11);
          auVar8 = vsubps_avx(auVar66,auVar273);
          auVar273 = vfmadd213ps_fma(auVar8,auVar114,auVar273);
          auVar8 = vsubps_avx(auVar65,auVar66);
          auVar8 = vfmadd213ps_fma(auVar8,auVar114,auVar66);
          auVar8 = vsubps_avx(auVar8,auVar273);
          auVar273 = vfmadd231ps_fma(auVar273,auVar8,auVar114);
          auVar115._0_8_ = CONCAT44(auVar8._4_4_ * 3.0,auVar8._0_4_ * 3.0);
          auVar115._8_4_ = auVar8._8_4_ * 3.0;
          auVar115._12_4_ = auVar8._12_4_ * 3.0;
          auVar221._8_8_ = auVar273._0_8_;
          auVar221._0_8_ = auVar273._0_8_;
          auVar8 = vshufpd_avx(auVar273,auVar273,3);
          auVar273 = vshufps_avx(auVar69,auVar69,0x55);
          auVar202 = vsubps_avx(auVar8,auVar221);
          auVar109 = vfmadd231ps_fma(auVar221,auVar273,auVar202);
          auVar262._8_8_ = auVar115._0_8_;
          auVar262._0_8_ = auVar115._0_8_;
          auVar8 = vshufpd_avx(auVar115,auVar115,3);
          auVar8 = vsubps_avx(auVar8,auVar262);
          auVar76 = vfmadd213ps_fma(auVar8,auVar273,auVar262);
          auVar273 = vmovshdup_avx(auVar76);
          auVar263._0_8_ = auVar273._0_8_ ^ 0x8000000080000000;
          auVar263._8_4_ = auVar273._8_4_ ^ 0x80000000;
          auVar263._12_4_ = auVar273._12_4_ ^ 0x80000000;
          auVar66 = vmovshdup_avx(auVar202);
          auVar8 = vunpcklps_avx(auVar66,auVar263);
          auVar65 = vshufps_avx(auVar8,auVar263,4);
          auVar280._0_8_ = auVar202._0_8_ ^ 0x8000000080000000;
          auVar280._8_4_ = auVar202._8_4_ ^ 0x80000000;
          auVar280._12_4_ = auVar202._12_4_ ^ 0x80000000;
          auVar8 = vmovlhps_avx(auVar280,auVar76);
          auVar8 = vshufps_avx(auVar8,auVar76,8);
          auVar273 = vfmsub231ss_fma(ZEXT416((uint)(auVar273._0_4_ * auVar202._0_4_)),auVar66,
                                     auVar76);
          auVar131._0_4_ = auVar273._0_4_;
          auVar131._4_4_ = auVar131._0_4_;
          auVar131._8_4_ = auVar131._0_4_;
          auVar131._12_4_ = auVar131._0_4_;
          auVar273 = vdivps_avx(auVar65,auVar131);
          auVar66 = vdivps_avx(auVar8,auVar131);
          fVar96 = auVar109._0_4_;
          fVar150 = auVar273._0_4_;
          auVar8 = vshufps_avx(auVar109,auVar109,0x55);
          fVar151 = auVar66._0_4_;
          local_720._4_4_ = fVar96 * auVar273._4_4_ + auVar8._4_4_ * auVar66._4_4_;
          local_720._0_4_ = fVar96 * fVar150 + auVar8._0_4_ * fVar151;
          uStack_718._0_4_ = fVar96 * auVar273._8_4_ + auVar8._8_4_ * auVar66._8_4_;
          uStack_718._4_4_ = fVar96 * auVar273._12_4_ + auVar8._12_4_ * auVar66._12_4_;
          auVar202 = vmovshdup_avx(auVar273);
          auVar8 = vinsertps_avx(auVar205,auVar240,0x1c);
          auVar274._0_4_ = auVar202._0_4_ * auVar8._0_4_;
          auVar274._4_4_ = auVar202._4_4_ * auVar8._4_4_;
          auVar274._8_4_ = auVar202._8_4_ * auVar8._8_4_;
          auVar274._12_4_ = auVar202._12_4_ * auVar8._12_4_;
          auVar65 = vinsertps_avx(auVar188,auVar228,0x1c);
          auVar248._0_4_ = auVar202._0_4_ * auVar65._0_4_;
          auVar248._4_4_ = auVar202._4_4_ * auVar65._4_4_;
          auVar248._8_4_ = auVar202._8_4_ * auVar65._8_4_;
          auVar248._12_4_ = auVar202._12_4_ * auVar65._12_4_;
          auVar122 = vminps_avx(auVar274,auVar248);
          auVar109 = vmaxps_avx(auVar248,auVar274);
          auVar202 = vinsertps_avx(auVar240,auVar205,0x4c);
          auVar126 = vmovshdup_avx(auVar66);
          auVar76 = vinsertps_avx(auVar228,auVar188,0x4c);
          auVar229._0_4_ = auVar126._0_4_ * auVar202._0_4_;
          auVar229._4_4_ = auVar126._4_4_ * auVar202._4_4_;
          auVar229._8_4_ = auVar126._8_4_ * auVar202._8_4_;
          auVar229._12_4_ = auVar126._12_4_ * auVar202._12_4_;
          auVar241._0_4_ = auVar126._0_4_ * auVar76._0_4_;
          auVar241._4_4_ = auVar126._4_4_ * auVar76._4_4_;
          auVar241._8_4_ = auVar126._8_4_ * auVar76._8_4_;
          auVar241._12_4_ = auVar126._12_4_ * auVar76._12_4_;
          auVar126 = vminps_avx(auVar229,auVar241);
          auVar87._0_4_ = auVar126._0_4_ + auVar122._0_4_;
          auVar87._4_4_ = auVar126._4_4_ + auVar122._4_4_;
          auVar87._8_4_ = auVar126._8_4_ + auVar122._8_4_;
          auVar87._12_4_ = auVar126._12_4_ + auVar122._12_4_;
          auVar122 = vmaxps_avx(auVar241,auVar229);
          auVar230._0_4_ = auVar109._0_4_ + auVar122._0_4_;
          auVar230._4_4_ = auVar109._4_4_ + auVar122._4_4_;
          auVar230._8_4_ = auVar109._8_4_ + auVar122._8_4_;
          auVar230._12_4_ = auVar109._12_4_ + auVar122._12_4_;
          auVar242._8_8_ = 0x3f80000000000000;
          auVar242._0_8_ = 0x3f80000000000000;
          auVar109 = vsubps_avx(auVar242,auVar230);
          auVar122 = vsubps_avx(auVar242,auVar87);
          auVar126 = vsubps_avx(auVar98,auVar69);
          auVar264._0_4_ = fVar150 * auVar8._0_4_;
          auVar264._4_4_ = fVar150 * auVar8._4_4_;
          auVar264._8_4_ = fVar150 * auVar8._8_4_;
          auVar264._12_4_ = fVar150 * auVar8._12_4_;
          auVar249._0_4_ = fVar150 * auVar65._0_4_;
          auVar249._4_4_ = fVar150 * auVar65._4_4_;
          auVar249._8_4_ = fVar150 * auVar65._8_4_;
          auVar249._12_4_ = fVar150 * auVar65._12_4_;
          auVar65 = vminps_avx(auVar264,auVar249);
          auVar8 = vmaxps_avx(auVar249,auVar264);
          auVar206._0_4_ = fVar151 * auVar202._0_4_;
          auVar206._4_4_ = fVar151 * auVar202._4_4_;
          auVar206._8_4_ = fVar151 * auVar202._8_4_;
          auVar206._12_4_ = fVar151 * auVar202._12_4_;
          auVar189._0_4_ = fVar151 * auVar76._0_4_;
          auVar189._4_4_ = fVar151 * auVar76._4_4_;
          auVar189._8_4_ = fVar151 * auVar76._8_4_;
          auVar189._12_4_ = fVar151 * auVar76._12_4_;
          auVar202 = vminps_avx(auVar206,auVar189);
          auVar265._0_4_ = auVar65._0_4_ + auVar202._0_4_;
          auVar265._4_4_ = auVar65._4_4_ + auVar202._4_4_;
          auVar265._8_4_ = auVar65._8_4_ + auVar202._8_4_;
          auVar265._12_4_ = auVar65._12_4_ + auVar202._12_4_;
          auVar202 = vsubps_avx(auVar75,auVar69);
          auVar65 = vmaxps_avx(auVar189,auVar206);
          fVar96 = auVar126._0_4_;
          auVar207._0_4_ = fVar96 * auVar109._0_4_;
          fVar97 = auVar126._4_4_;
          auVar207._4_4_ = fVar97 * auVar109._4_4_;
          fVar64 = auVar126._8_4_;
          auVar207._8_4_ = fVar64 * auVar109._8_4_;
          fVar174 = auVar126._12_4_;
          auVar207._12_4_ = fVar174 * auVar109._12_4_;
          auVar190._0_4_ = auVar8._0_4_ + auVar65._0_4_;
          auVar190._4_4_ = auVar8._4_4_ + auVar65._4_4_;
          auVar190._8_4_ = auVar8._8_4_ + auVar65._8_4_;
          auVar190._12_4_ = auVar8._12_4_ + auVar65._12_4_;
          auVar250._8_8_ = 0x3f800000;
          auVar250._0_8_ = 0x3f800000;
          auVar8 = vsubps_avx(auVar250,auVar190);
          auVar65 = vsubps_avx(auVar250,auVar265);
          auVar266._0_4_ = fVar96 * auVar122._0_4_;
          auVar266._4_4_ = fVar97 * auVar122._4_4_;
          auVar266._8_4_ = fVar64 * auVar122._8_4_;
          auVar266._12_4_ = fVar174 * auVar122._12_4_;
          fVar152 = auVar202._0_4_;
          auVar231._0_4_ = fVar152 * auVar109._0_4_;
          fVar153 = auVar202._4_4_;
          auVar231._4_4_ = fVar153 * auVar109._4_4_;
          fVar154 = auVar202._8_4_;
          auVar231._8_4_ = fVar154 * auVar109._8_4_;
          fVar246 = auVar202._12_4_;
          auVar231._12_4_ = fVar246 * auVar109._12_4_;
          auVar88._0_4_ = fVar152 * auVar122._0_4_;
          auVar88._4_4_ = fVar153 * auVar122._4_4_;
          auVar88._8_4_ = fVar154 * auVar122._8_4_;
          auVar88._12_4_ = fVar246 * auVar122._12_4_;
          auVar281._0_4_ = fVar96 * auVar8._0_4_;
          auVar281._4_4_ = fVar97 * auVar8._4_4_;
          auVar281._8_4_ = fVar64 * auVar8._8_4_;
          auVar281._12_4_ = fVar174 * auVar8._12_4_;
          auVar243._0_4_ = fVar96 * auVar65._0_4_;
          auVar243._4_4_ = fVar97 * auVar65._4_4_;
          auVar243._8_4_ = fVar64 * auVar65._8_4_;
          auVar243._12_4_ = fVar174 * auVar65._12_4_;
          auVar191._0_4_ = fVar152 * auVar8._0_4_;
          auVar191._4_4_ = fVar153 * auVar8._4_4_;
          auVar191._8_4_ = fVar154 * auVar8._8_4_;
          auVar191._12_4_ = fVar246 * auVar8._12_4_;
          auVar251._0_4_ = fVar152 * auVar65._0_4_;
          auVar251._4_4_ = fVar153 * auVar65._4_4_;
          auVar251._8_4_ = fVar154 * auVar65._8_4_;
          auVar251._12_4_ = fVar246 * auVar65._12_4_;
          auVar8 = vminps_avx(auVar281,auVar243);
          auVar65 = vminps_avx(auVar191,auVar251);
          auVar8 = vminps_avx(auVar8,auVar65);
          auVar65 = vmaxps_avx(auVar243,auVar281);
          auVar202 = vminps_avx(auVar207,auVar266);
          auVar76 = vminps_avx(auVar231,auVar88);
          auVar202 = vminps_avx(auVar202,auVar76);
          auVar8 = vhaddps_avx(auVar8,auVar202);
          auVar202 = vmaxps_avx(auVar251,auVar191);
          auVar65 = vmaxps_avx(auVar202,auVar65);
          auVar202 = vmaxps_avx(auVar266,auVar207);
          auVar76 = vmaxps_avx(auVar88,auVar231);
          auVar202 = vmaxps_avx(auVar76,auVar202);
          auVar65 = vhaddps_avx(auVar65,auVar202);
          auVar202 = vshufps_avx(auVar69,auVar69,0x54);
          auVar202 = vsubps_avx(auVar202,_local_720);
          auVar8 = vshufps_avx(auVar8,auVar8,0xe8);
          auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
          auVar208._0_4_ = auVar202._0_4_ + auVar8._0_4_;
          auVar208._4_4_ = auVar202._4_4_ + auVar8._4_4_;
          auVar208._8_4_ = auVar202._8_4_ + auVar8._8_4_;
          auVar208._12_4_ = auVar202._12_4_ + auVar8._12_4_;
          auVar192._0_4_ = auVar202._0_4_ + auVar65._0_4_;
          auVar192._4_4_ = auVar202._4_4_ + auVar65._4_4_;
          auVar192._8_4_ = auVar202._8_4_ + auVar65._8_4_;
          auVar192._12_4_ = auVar202._12_4_ + auVar65._12_4_;
          auVar8 = vmaxps_avx(auVar98,auVar208);
          auVar65 = vminps_avx(auVar192,auVar75);
          auVar8 = vcmpps_avx(auVar65,auVar8,1);
          auVar8 = vshufps_avx(auVar8,auVar8,0x50);
          _local_780 = vinsertps_avx(auVar74,ZEXT416((uint)auVar121._0_4_),0x10);
          if ((auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar8[0xf] < '\0') goto LAB_016af7c1;
          bVar58 = 0;
          if ((auVar172._0_4_ < auVar208._0_4_) && (bVar58 = 0, auVar192._0_4_ < auVar75._0_4_)) {
            auVar65 = vmovshdup_avx(auVar208);
            auVar8 = vcmpps_avx(auVar192,auVar75,1);
            bVar58 = auVar8[4] & auVar74._0_4_ < auVar65._0_4_;
          }
          if (((3 < (uint)uVar60 || fVar135 < 0.001) | bVar58) == 1) {
            lVar57 = 200;
            do {
              fVar64 = auVar202._0_4_;
              fVar97 = 1.0 - fVar64;
              fVar135 = fVar97 * fVar97 * fVar97;
              fVar96 = fVar64 * 3.0 * fVar97 * fVar97;
              fVar97 = fVar97 * fVar64 * fVar64 * 3.0;
              auVar146._4_4_ = fVar135;
              auVar146._0_4_ = fVar135;
              auVar146._8_4_ = fVar135;
              auVar146._12_4_ = fVar135;
              auVar105._4_4_ = fVar96;
              auVar105._0_4_ = fVar96;
              auVar105._8_4_ = fVar96;
              auVar105._12_4_ = fVar96;
              auVar89._4_4_ = fVar97;
              auVar89._0_4_ = fVar97;
              auVar89._8_4_ = fVar97;
              auVar89._12_4_ = fVar97;
              fVar64 = fVar64 * fVar64 * fVar64;
              auVar167._0_4_ = (float)local_540._0_4_ * fVar64;
              auVar167._4_4_ = (float)local_540._4_4_ * fVar64;
              auVar167._8_4_ = fStack_538 * fVar64;
              auVar167._12_4_ = fStack_534 * fVar64;
              auVar8 = vfmadd231ps_fma(auVar167,auVar11,auVar89);
              auVar8 = vfmadd231ps_fma(auVar8,auVar10,auVar105);
              auVar8 = vfmadd231ps_fma(auVar8,auVar9,auVar146);
              auVar90._8_8_ = auVar8._0_8_;
              auVar90._0_8_ = auVar8._0_8_;
              auVar8 = vshufpd_avx(auVar8,auVar8,3);
              auVar65 = vshufps_avx(auVar202,auVar202,0x55);
              auVar8 = vsubps_avx(auVar8,auVar90);
              auVar65 = vfmadd213ps_fma(auVar8,auVar65,auVar90);
              fVar135 = auVar65._0_4_;
              auVar8 = vshufps_avx(auVar65,auVar65,0x55);
              auVar91._0_4_ = fVar150 * fVar135 + fVar151 * auVar8._0_4_;
              auVar91._4_4_ = auVar273._4_4_ * fVar135 + auVar66._4_4_ * auVar8._4_4_;
              auVar91._8_4_ = auVar273._8_4_ * fVar135 + auVar66._8_4_ * auVar8._8_4_;
              auVar91._12_4_ = auVar273._12_4_ * fVar135 + auVar66._12_4_ * auVar8._12_4_;
              auVar202 = vsubps_avx(auVar202,auVar91);
              auVar8 = vandps_avx(auVar278,auVar65);
              auVar65 = vshufps_avx(auVar8,auVar8,0xf5);
              auVar8 = vmaxss_avx(auVar65,auVar8);
              if (auVar8._0_4_ < (float)local_3a0._0_4_) {
                local_120 = auVar202._0_4_;
                if ((0.0 <= local_120) && (local_120 <= 1.0)) {
                  auVar8 = vmovshdup_avx(auVar202);
                  fVar135 = auVar8._0_4_;
                  if ((0.0 <= fVar135) && (fVar135 <= 1.0)) {
                    auVar273 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                             ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                             0x1c);
                    auVar122 = vinsertps_avx(auVar273,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                    m128[2]),0x28);
                    auVar273 = vdpps_avx(auVar122,local_550,0x7f);
                    auVar66 = vdpps_avx(auVar122,local_560,0x7f);
                    auVar65 = vdpps_avx(auVar122,local_3b0,0x7f);
                    auVar98 = vdpps_avx(auVar122,local_3c0,0x7f);
                    auVar75 = vdpps_avx(auVar122,local_3d0,0x7f);
                    auVar76 = vdpps_avx(auVar122,local_3e0,0x7f);
                    auVar109 = vdpps_avx(auVar122,local_3f0,0x7f);
                    auVar122 = vdpps_avx(auVar122,local_400,0x7f);
                    fVar150 = 1.0 - fVar135;
                    auVar273 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * auVar75._0_4_)),
                                               ZEXT416((uint)fVar150),auVar273);
                    auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar135)),
                                              ZEXT416((uint)fVar150),auVar66);
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar109._0_4_ * fVar135)),
                                              ZEXT416((uint)fVar150),auVar65);
                    auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * auVar122._0_4_)),
                                              ZEXT416((uint)fVar150),auVar98);
                    fVar97 = 1.0 - local_120;
                    fVar150 = fVar97 * local_120 * local_120 * 3.0;
                    fVar174 = local_120 * local_120 * local_120;
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * auVar98._0_4_)),
                                              ZEXT416((uint)fVar150),auVar65);
                    fVar151 = local_120 * 3.0 * fVar97 * fVar97;
                    auVar66 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar151),auVar66);
                    fVar96 = fVar97 * fVar97 * fVar97;
                    auVar273 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar96),auVar273);
                    auVar71 = ZEXT1632(auVar273);
                    fVar64 = auVar273._0_4_;
                    if (((fVar62 <= fVar64) &&
                        (fVar152 = *(float *)(ray + k * 4 + 0x100), fVar64 <= fVar152)) &&
                       (pGVar3 = (context->scene->geometries).items[uVar55].ptr,
                       (pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                      auVar66 = vshufps_avx(auVar202,auVar202,0x55);
                      auVar222._8_4_ = 0x3f800000;
                      auVar222._0_8_ = &DAT_3f8000003f800000;
                      auVar222._12_4_ = 0x3f800000;
                      auVar65 = vsubps_avx(auVar222,auVar66);
                      fVar153 = auVar66._0_4_;
                      auVar232._0_4_ = fVar153 * (float)local_580._0_4_;
                      fVar154 = auVar66._4_4_;
                      auVar232._4_4_ = fVar154 * (float)local_580._4_4_;
                      fVar246 = auVar66._8_4_;
                      auVar232._8_4_ = fVar246 * fStack_578;
                      fVar257 = auVar66._12_4_;
                      auVar232._12_4_ = fVar257 * fStack_574;
                      auVar244._0_4_ = fVar153 * (float)local_5c0._0_4_;
                      auVar244._4_4_ = fVar154 * (float)local_5c0._4_4_;
                      auVar244._8_4_ = fVar246 * fStack_5b8;
                      auVar244._12_4_ = fVar257 * fStack_5b4;
                      auVar252._0_4_ = fVar153 * (float)local_5d0._0_4_;
                      auVar252._4_4_ = fVar154 * (float)local_5d0._4_4_;
                      auVar252._8_4_ = fVar246 * fStack_5c8;
                      auVar252._12_4_ = fVar257 * fStack_5c4;
                      auVar209._0_4_ = fVar153 * fVar155;
                      auVar209._4_4_ = fVar154 * fVar173;
                      auVar209._8_4_ = fVar246 * fVar175;
                      auVar209._12_4_ = fVar257 * fVar177;
                      auVar66 = vfmadd231ps_fma(auVar232,auVar65,local_570);
                      auVar98 = vfmadd231ps_fma(auVar244,auVar65,local_5a0);
                      auVar75 = vfmadd231ps_fma(auVar252,auVar65,local_5b0);
                      auVar202 = vfmadd231ps_fma(auVar209,auVar65,local_590);
                      auVar66 = vsubps_avx(auVar98,auVar66);
                      auVar65 = vsubps_avx(auVar75,auVar98);
                      auVar98 = vsubps_avx(auVar202,auVar75);
                      auVar253._0_4_ = local_120 * auVar65._0_4_;
                      auVar253._4_4_ = local_120 * auVar65._4_4_;
                      auVar253._8_4_ = local_120 * auVar65._8_4_;
                      auVar253._12_4_ = local_120 * auVar65._12_4_;
                      auVar193._4_4_ = fVar97;
                      auVar193._0_4_ = fVar97;
                      auVar193._8_4_ = fVar97;
                      auVar193._12_4_ = fVar97;
                      auVar66 = vfmadd231ps_fma(auVar253,auVar193,auVar66);
                      auVar210._0_4_ = local_120 * auVar98._0_4_;
                      auVar210._4_4_ = local_120 * auVar98._4_4_;
                      auVar210._8_4_ = local_120 * auVar98._8_4_;
                      auVar210._12_4_ = local_120 * auVar98._12_4_;
                      auVar65 = vfmadd231ps_fma(auVar210,auVar193,auVar65);
                      auVar211._0_4_ = local_120 * auVar65._0_4_;
                      auVar211._4_4_ = local_120 * auVar65._4_4_;
                      auVar211._8_4_ = local_120 * auVar65._8_4_;
                      auVar211._12_4_ = local_120 * auVar65._12_4_;
                      auVar65 = vfmadd231ps_fma(auVar211,auVar193,auVar66);
                      auVar168._0_4_ = fVar174 * (float)local_440._0_4_;
                      auVar168._4_4_ = fVar174 * (float)local_440._4_4_;
                      auVar168._8_4_ = fVar174 * fStack_438;
                      auVar168._12_4_ = fVar174 * fStack_434;
                      auVar116._4_4_ = fVar150;
                      auVar116._0_4_ = fVar150;
                      auVar116._8_4_ = fVar150;
                      auVar116._12_4_ = fVar150;
                      auVar66 = vfmadd132ps_fma(auVar116,auVar168,local_430);
                      auVar147._4_4_ = fVar151;
                      auVar147._0_4_ = fVar151;
                      auVar147._8_4_ = fVar151;
                      auVar147._12_4_ = fVar151;
                      auVar66 = vfmadd132ps_fma(auVar147,auVar66,local_420);
                      auVar169._0_4_ = auVar65._0_4_ * 3.0;
                      auVar169._4_4_ = auVar65._4_4_ * 3.0;
                      auVar169._8_4_ = auVar65._8_4_ * 3.0;
                      auVar169._12_4_ = auVar65._12_4_ * 3.0;
                      auVar132._4_4_ = fVar96;
                      auVar132._0_4_ = fVar96;
                      auVar132._8_4_ = fVar96;
                      auVar132._12_4_ = fVar96;
                      auVar65 = vfmadd132ps_fma(auVar132,auVar66,local_410);
                      auVar66 = vshufps_avx(auVar169,auVar169,0xc9);
                      auVar117._0_4_ = auVar65._0_4_ * auVar66._0_4_;
                      auVar117._4_4_ = auVar65._4_4_ * auVar66._4_4_;
                      auVar117._8_4_ = auVar65._8_4_ * auVar66._8_4_;
                      auVar117._12_4_ = auVar65._12_4_ * auVar66._12_4_;
                      auVar66 = vshufps_avx(auVar65,auVar65,0xc9);
                      auVar66 = vfmsub231ps_fma(auVar117,auVar169,auVar66);
                      local_140 = auVar66._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar64;
                        uVar63 = vextractps_avx(auVar66,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar63;
                        uVar63 = vextractps_avx(auVar66,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar63;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                        *(float *)(ray + k * 4 + 0x1e0) = local_120;
                        *(float *)(ray + k * 4 + 0x200) = fVar135;
                        *(uint *)(ray + k * 4 + 0x220) = uVar54;
                        *(int *)(ray + k * 4 + 0x240) = (int)uVar55;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        local_100._0_8_ = auVar8._0_8_;
                        local_100._8_8_ = local_100._0_8_;
                        local_100._16_8_ = local_100._0_8_;
                        local_100._24_8_ = local_100._0_8_;
                        auVar8 = vmovshdup_avx(auVar66);
                        local_180 = auVar8._0_8_;
                        auVar8 = vshufps_avx(auVar66,auVar66,0xaa);
                        local_160 = auVar8._0_8_;
                        uStack_178 = local_180;
                        uStack_170 = local_180;
                        uStack_168 = local_180;
                        uStack_158 = local_160;
                        uStack_150 = local_160;
                        uStack_148 = local_160;
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = CONCAT44(uStack_2fc,local_300);
                        uStack_d8 = CONCAT44(uStack_2f4,uStack_2f8);
                        uStack_d0 = CONCAT44(uStack_2ec,uStack_2f0);
                        uStack_c8 = CONCAT44(uStack_2e4,uStack_2e8);
                        local_c0 = CONCAT44(uStack_2dc,local_2e0);
                        uStack_b8 = CONCAT44(uStack_2d4,uStack_2d8);
                        uStack_b0 = CONCAT44(uStack_2cc,uStack_2d0);
                        uStack_a8 = CONCAT44(uStack_2c4,uStack_2c8);
                        auVar13 = vpcmpeqd_avx2(local_100,local_100);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = fVar64;
                        local_480 = local_320._0_8_;
                        uStack_478 = local_320._8_8_;
                        uStack_470 = local_320._16_8_;
                        uStack_468 = local_320._24_8_;
                        local_630.valid = (int *)&local_480;
                        local_630.geometryUserPtr = pGVar3->userPtr;
                        local_630.context = context->user;
                        local_630.hit = (RTCHitN *)&local_180;
                        local_630.N = 8;
                        local_630.ray = (RTCRayN *)ray;
                        if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_4a0._0_8_ = context;
                          local_600._0_8_ = uVar55;
                          auVar71 = ZEXT1632(auVar273);
                          (*pGVar3->intersectionFilterN)(&local_630);
                          auVar95._8_56_ = extraout_var;
                          auVar95._0_8_ = extraout_XMM1_Qa;
                          auVar13 = vpcmpeqd_avx2(auVar95._0_32_,auVar95._0_32_);
                          uVar55 = local_600._0_8_;
                          context = (RayQueryContext *)local_4a0._0_8_;
                        }
                        auVar45._8_8_ = uStack_478;
                        auVar45._0_8_ = local_480;
                        auVar45._16_8_ = uStack_470;
                        auVar45._24_8_ = uStack_468;
                        auVar73 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar45);
                        auVar72 = auVar13 & ~auVar73;
                        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar72 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar72 >> 0x7f,0) == '\0') &&
                              (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar72 >> 0xbf,0) == '\0') &&
                            (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar72[0x1f]) {
                          auVar73 = auVar73 ^ auVar13;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            local_600._0_8_ = uVar55;
                            auVar71 = ZEXT1632(auVar71._0_16_);
                            (*p_Var6)(&local_630);
                            uVar55 = local_600._0_8_;
                          }
                          auVar46._8_8_ = uStack_478;
                          auVar46._0_8_ = local_480;
                          auVar46._16_8_ = uStack_470;
                          auVar46._24_8_ = uStack_468;
                          auVar13 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar46
                                                 );
                          auVar72 = vpcmpeqd_avx2(auVar71,auVar71);
                          auVar73 = auVar13 ^ auVar72;
                          auVar71 = auVar72 & ~auVar13;
                          if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar71 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar71 >> 0x7f,0) != '\0') ||
                                (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar71 >> 0xbf,0) != '\0') ||
                              (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar71[0x1f] < '\0') {
                            auVar94._0_4_ = auVar13._0_4_ ^ auVar72._0_4_;
                            auVar94._4_4_ = auVar13._4_4_ ^ auVar72._4_4_;
                            auVar94._8_4_ = auVar13._8_4_ ^ auVar72._8_4_;
                            auVar94._12_4_ = auVar13._12_4_ ^ auVar72._12_4_;
                            auVar94._16_4_ = auVar13._16_4_ ^ auVar72._16_4_;
                            auVar94._20_4_ = auVar13._20_4_ ^ auVar72._20_4_;
                            auVar94._24_4_ = auVar13._24_4_ ^ auVar72._24_4_;
                            auVar94._28_4_ = auVar13._28_4_ ^ auVar72._28_4_;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])local_630.hit);
                            *(undefined1 (*) [32])(local_630.ray + 0x180) = auVar71;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                              (local_630.hit + 0x20));
                            *(undefined1 (*) [32])(local_630.ray + 0x1a0) = auVar71;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                              (local_630.hit + 0x40));
                            *(undefined1 (*) [32])(local_630.ray + 0x1c0) = auVar71;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                              (local_630.hit + 0x60));
                            *(undefined1 (*) [32])(local_630.ray + 0x1e0) = auVar71;
                            auVar71 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                              (local_630.hit + 0x80));
                            *(undefined1 (*) [32])(local_630.ray + 0x200) = auVar71;
                            auVar71 = vpmaskmovd_avx2(auVar94,*(undefined1 (*) [32])
                                                               (local_630.hit + 0xa0));
                            *(undefined1 (*) [32])(local_630.ray + 0x220) = auVar71;
                            auVar71 = vpmaskmovd_avx2(auVar94,*(undefined1 (*) [32])
                                                               (local_630.hit + 0xc0));
                            *(undefined1 (*) [32])(local_630.ray + 0x240) = auVar71;
                            auVar71 = vpmaskmovd_avx2(auVar94,*(undefined1 (*) [32])
                                                               (local_630.hit + 0xe0));
                            *(undefined1 (*) [32])(local_630.ray + 0x260) = auVar71;
                            auVar71 = vpmaskmovd_avx2(auVar94,*(undefined1 (*) [32])
                                                               (local_630.hit + 0x100));
                            *(undefined1 (*) [32])(local_630.ray + 0x280) = auVar71;
                          }
                        }
                        if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar73 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar73 >> 0x7f,0) == '\0') &&
                              (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar73 >> 0xbf,0) == '\0') &&
                            (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar73[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar152;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar57 = lVar57 + -1;
            } while (lVar57 != 0);
          }
          else {
            bVar40 = false;
          }
        }
      }
    } while (bVar40);
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar149),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }